

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz_old.cpp
# Opt level: O1

void anon_unknown.dwarf_28c7df::scaleImage<(anonymous_namespace)::Scaler3x>
               (uint32_t *src,uint32_t *trg,int srcWidth,int srcHeight,ScalerCfg *cfg,int yFirst,
               int yLast)

{
  ulong uVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  ulong __n;
  char cVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint32_t colAlpha_16;
  uint uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  void *__s;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint *puVar34;
  int x;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  long lVar39;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  int iVar45;
  uint *puVar46;
  bool bVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  anon_class_8_1_ba1d3bc4 dist;
  ulong local_b0;
  ulong local_80;
  
  uVar16 = 0;
  if (0 < yFirst) {
    uVar16 = (ulong)(uint)yFirst;
  }
  if (srcHeight < yLast) {
    yLast = srcHeight;
  }
  iVar14 = (int)uVar16;
  if (0 < srcWidth && iVar14 < yLast) {
    lVar22 = (long)(srcWidth * yLast * 9);
    __n = (ulong)(uint)srcWidth;
    __s = (void *)((long)trg + (lVar22 * 4 - __n));
    memset(__s,0,__n);
    if (0 < yFirst) {
      iVar10 = 2;
      if (2 < yFirst) {
        iVar10 = yFirst;
      }
      iVar24 = srcHeight + -1;
      iVar17 = iVar14;
      if (iVar24 < iVar14) {
        iVar17 = iVar24;
      }
      iVar27 = iVar14 + 1;
      if (iVar24 < iVar14 + 1) {
        iVar27 = iVar24;
      }
      if (0 < srcWidth) {
        iVar24 = (iVar10 + -2) * srcWidth;
        uVar25 = (iVar14 + -1) * srcWidth;
        iVar17 = iVar17 * srcWidth;
        iVar10 = srcWidth + -1;
        lVar22 = lVar22 * 4 - __n;
        uVar12 = 0;
        do {
          iVar45 = (int)uVar12;
          iVar30 = 1;
          if (1 < iVar45) {
            iVar30 = iVar45;
          }
          uVar1 = uVar12 + 1;
          iVar11 = (int)uVar1;
          if (iVar10 < (int)uVar1) {
            iVar11 = iVar10;
          }
          iVar7 = iVar45 + 2;
          if (iVar10 < iVar45 + 2) {
            iVar7 = iVar10;
          }
          uVar26 = src[(long)iVar24 + uVar12];
          lVar23 = (long)iVar11;
          uVar20 = src[iVar24 + lVar23];
          uVar29 = src[(ulong)uVar25 + (ulong)(iVar30 - 1)];
          uVar4 = src[uVar25 + uVar12];
          uVar15 = src[(ulong)uVar25 + lVar23];
          uVar40 = src[(ulong)uVar25 + (long)iVar7];
          uVar37 = src[(long)iVar17 + (ulong)(iVar30 - 1)];
          uVar19 = src[(long)iVar17 + uVar12];
          uVar18 = src[iVar17 + lVar23];
          uVar28 = src[(long)iVar17 + (long)iVar7];
          uVar5 = src[(long)(iVar27 * srcWidth) + uVar12];
          uVar32 = src[iVar27 * srcWidth + lVar23];
          if (((uVar4 == uVar15) && (uVar19 == uVar18)) || ((uVar4 == uVar19 && (uVar15 == uVar18)))
             ) {
LAB_00417267:
            lVar23 = 0;
          }
          else {
            dVar50 = 0.0;
            dVar49 = 0.0;
            if (uVar37 != uVar4) {
              dVar49 = (double)(int)((uVar37 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff));
              dVar51 = (double)(int)((uVar37 & 0xff) - (uVar4 & 0xff));
              dVar52 = dVar51 * 0.0722 +
                       (double)(int)((uVar37 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) * 0.7152 +
                       dVar49 * 0.2126;
              dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
              dVar49 = (dVar49 - dVar52) * 0.63500127000254;
              dVar52 = dVar52 * cfg->luminanceWeight_;
              dVar49 = SQRT(dVar49 * dVar49 + dVar51 * dVar51 + dVar52 * dVar52);
            }
            if (uVar4 != uVar20) {
              dVar50 = (double)(int)((uVar4 >> 0x10 & 0xff) - (uVar20 >> 0x10 & 0xff));
              dVar51 = (double)(int)((uVar4 & 0xff) - (uVar20 & 0xff));
              dVar52 = dVar51 * 0.0722 +
                       (double)(int)((uVar4 >> 8 & 0xff) - (uVar20 >> 8 & 0xff)) * 0.7152 +
                       dVar50 * 0.2126;
              dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
              dVar50 = (dVar50 - dVar52) * 0.63500127000254;
              dVar52 = dVar52 * cfg->luminanceWeight_;
              dVar50 = SQRT(dVar50 * dVar50 + dVar51 * dVar51 + dVar52 * dVar52);
            }
            dVar51 = 0.0;
            dVar52 = 0.0;
            if (uVar5 != uVar18) {
              dVar52 = (double)(int)((uVar5 >> 0x10 & 0xff) - (uVar18 >> 0x10 & 0xff));
              dVar53 = (double)(int)((uVar5 & 0xff) - (uVar18 & 0xff));
              dVar55 = dVar53 * 0.0722 +
                       (double)(int)((uVar5 >> 8 & 0xff) - (uVar18 >> 8 & 0xff)) * 0.7152 +
                       dVar52 * 0.2126;
              dVar53 = (dVar53 - dVar55) * 0.5389092476826902;
              dVar52 = (dVar52 - dVar55) * 0.63500127000254;
              dVar55 = dVar55 * cfg->luminanceWeight_;
              dVar52 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar55 * dVar55);
            }
            if (uVar18 != uVar40) {
              dVar51 = (double)(int)((uVar18 >> 0x10 & 0xff) - (uVar40 >> 0x10 & 0xff));
              dVar53 = (double)(int)((uVar18 & 0xff) - (uVar40 & 0xff));
              dVar55 = dVar53 * 0.0722 +
                       (double)(int)((uVar18 >> 8 & 0xff) - (uVar40 >> 8 & 0xff)) * 0.7152 +
                       dVar51 * 0.2126;
              dVar53 = (dVar53 - dVar55) * 0.5389092476826902;
              dVar51 = (dVar51 - dVar55) * 0.63500127000254;
              dVar55 = dVar55 * cfg->luminanceWeight_;
              dVar51 = SQRT(dVar51 * dVar51 + dVar53 * dVar53 + dVar55 * dVar55);
            }
            dVar55 = 0.0;
            dVar53 = 0.0;
            if (uVar19 != uVar15) {
              dVar53 = (double)(int)((uVar19 >> 0x10 & 0xff) - (uVar15 >> 0x10 & 0xff));
              dVar56 = (double)(int)((uVar19 & 0xff) - (uVar15 & 0xff));
              dVar58 = dVar56 * 0.0722 +
                       (double)(int)((uVar19 >> 8 & 0xff) - (uVar15 >> 8 & 0xff)) * 0.7152 +
                       dVar53 * 0.2126;
              dVar56 = (dVar56 - dVar58) * 0.5389092476826902;
              dVar59 = dVar58 * cfg->luminanceWeight_;
              dVar53 = (dVar53 - dVar58) * 0.63500127000254;
              dVar53 = SQRT(dVar53 * dVar53 + dVar56 * dVar56 + dVar59 * dVar59) * 4.0;
            }
            if (uVar29 != uVar19) {
              dVar55 = (double)(int)((uVar29 >> 0x10 & 0xff) - (uVar19 >> 0x10 & 0xff));
              dVar56 = (double)(int)((uVar29 & 0xff) - (uVar19 & 0xff));
              dVar58 = dVar56 * 0.0722 +
                       (double)(int)((uVar29 >> 8 & 0xff) - (uVar19 >> 8 & 0xff)) * 0.7152 +
                       dVar55 * 0.2126;
              dVar56 = (dVar56 - dVar58) * 0.5389092476826902;
              dVar55 = (dVar55 - dVar58) * 0.63500127000254;
              dVar58 = dVar58 * cfg->luminanceWeight_;
              dVar55 = SQRT(dVar55 * dVar55 + dVar56 * dVar56 + dVar58 * dVar58);
            }
            dVar58 = 0.0;
            dVar56 = 0.0;
            if (uVar19 != uVar32) {
              dVar54 = (double)(int)((uVar19 >> 0x10 & 0xff) - (uVar32 >> 0x10 & 0xff));
              dVar56 = (double)(int)((uVar19 & 0xff) - (uVar32 & 0xff));
              dVar59 = dVar56 * 0.0722 +
                       (double)(int)((uVar19 >> 8 & 0xff) - (uVar32 >> 8 & 0xff)) * 0.7152 +
                       dVar54 * 0.2126;
              dVar56 = (dVar56 - dVar59) * 0.5389092476826902;
              dVar54 = (dVar54 - dVar59) * 0.63500127000254;
              dVar59 = dVar59 * cfg->luminanceWeight_;
              dVar56 = SQRT(dVar54 * dVar54 + dVar56 * dVar56 + dVar59 * dVar59);
            }
            if (uVar26 != uVar15) {
              dVar58 = (double)(int)((uVar26 >> 0x10 & 0xff) - (uVar15 >> 0x10 & 0xff));
              dVar59 = (double)(int)((uVar26 & 0xff) - (uVar15 & 0xff));
              dVar54 = dVar59 * 0.0722 +
                       (double)(int)((uVar26 >> 8 & 0xff) - (uVar15 >> 8 & 0xff)) * 0.7152 +
                       dVar58 * 0.2126;
              dVar59 = (dVar59 - dVar54) * 0.5389092476826902;
              dVar58 = (dVar58 - dVar54) * 0.63500127000254;
              dVar54 = dVar54 * cfg->luminanceWeight_;
              dVar58 = SQRT(dVar58 * dVar58 + dVar59 * dVar59 + dVar54 * dVar54);
            }
            dVar59 = 0.0;
            dVar54 = 0.0;
            if (uVar15 != uVar28) {
              dVar60 = (double)(int)((uVar15 >> 0x10 & 0xff) - (uVar28 >> 0x10 & 0xff));
              dVar48 = (double)(int)((uVar15 & 0xff) - (uVar28 & 0xff));
              dVar54 = dVar48 * 0.0722 +
                       (double)(int)((uVar15 >> 8 & 0xff) - (uVar28 >> 8 & 0xff)) * 0.7152 +
                       dVar60 * 0.2126;
              dVar48 = (dVar48 - dVar54) * 0.5389092476826902;
              dVar60 = (dVar60 - dVar54) * 0.63500127000254;
              dVar54 = dVar54 * cfg->luminanceWeight_;
              dVar54 = SQRT(dVar60 * dVar60 + dVar48 * dVar48 + dVar54 * dVar54);
            }
            if (uVar4 != uVar18) {
              dVar57 = (double)(int)((uVar4 >> 0x10 & 0xff) - (uVar18 >> 0x10 & 0xff));
              dVar59 = (double)(int)((uVar4 & 0xff) - (uVar18 & 0xff));
              dVar48 = dVar59 * 0.0722 +
                       (double)(int)((uVar4 >> 8 & 0xff) - (uVar18 >> 8 & 0xff)) * 0.7152 +
                       dVar57 * 0.2126;
              dVar59 = (dVar59 - dVar48) * 0.5389092476826902;
              dVar60 = dVar48 * cfg->luminanceWeight_;
              dVar48 = (dVar57 - dVar48) * 0.63500127000254;
              dVar59 = SQRT(dVar48 * dVar48 + dVar59 * dVar59 + dVar60 * dVar60) * 4.0;
            }
            dVar53 = dVar50 + dVar49 + dVar52 + dVar51 + dVar53;
            dVar59 = dVar56 + dVar55 + dVar58 + dVar54 + dVar59;
            if (dVar59 <= dVar53) {
              if (dVar53 <= dVar59) goto LAB_00417267;
              lVar23 = (ulong)(dVar59 * cfg->dominantDirectionThreshold < dVar53) + 1;
              bVar47 = uVar19 == uVar18;
              uVar18 = uVar4;
              if (bVar47) {
                lVar23 = 0;
              }
            }
            else {
              lVar23 = 0x100000000;
              if (dVar53 * cfg->dominantDirectionThreshold < dVar59) {
                lVar23 = 0x200000000;
              }
              if (uVar18 == uVar15) {
                lVar23 = 0;
              }
            }
            if (uVar18 == uVar19) {
              lVar23 = 0;
            }
          }
          pbVar2 = (byte *)((long)trg + uVar12 + lVar22);
          *pbVar2 = *pbVar2 | (char)lVar23 * '\x04';
          if (uVar1 < __n) {
            pbVar2 = (byte *)((long)trg + uVar12 + lVar22 + 1);
            *pbVar2 = *pbVar2 | (byte)((ulong)lVar23 >> 0x20);
          }
          uVar12 = uVar1;
        } while (__n != uVar1);
      }
    }
    if (iVar14 < yLast) {
      uVar25 = srcHeight - 1;
      iVar14 = srcWidth + -1;
      uVar12 = (ulong)(uint)(srcWidth * 3);
      do {
        iVar17 = (int)uVar16;
        iVar10 = 1;
        if (1 < iVar17) {
          iVar10 = iVar17;
        }
        uVar1 = uVar16 + 1;
        uVar41 = uVar1;
        if ((int)uVar25 < (int)uVar1) {
          uVar41 = (ulong)uVar25;
        }
        uVar26 = iVar17 + 2U;
        if ((int)uVar25 < (int)(iVar17 + 2U)) {
          uVar26 = uVar25;
        }
        if (0 < srcWidth) {
          iVar10 = (iVar10 + -1) * srcWidth;
          lVar22 = uVar16 * __n;
          iVar24 = (int)uVar41 * srcWidth;
          puVar46 = trg + (uint)(iVar17 * srcWidth * 9);
          local_b0 = 0;
          local_80 = 0;
          do {
            iVar27 = (int)local_b0;
            iVar17 = 1;
            if (1 < iVar27) {
              iVar17 = iVar27;
            }
            uVar41 = (ulong)(iVar17 - 1);
            uVar16 = local_b0 + 1;
            iVar17 = (int)uVar16;
            if (iVar14 < (int)uVar16) {
              iVar17 = iVar14;
            }
            iVar30 = iVar27 + 2;
            if (iVar14 < iVar27 + 2) {
              iVar30 = iVar14;
            }
            uVar20 = src[(long)iVar10 + local_b0];
            lVar23 = (long)iVar17;
            uVar29 = src[iVar10 + lVar23];
            uVar4 = src[lVar22 + uVar41];
            uVar15 = src[lVar22 + local_b0];
            uVar40 = src[lVar22 + lVar23];
            uVar37 = src[lVar22 + iVar30];
            uVar19 = src[(long)iVar24 + uVar41];
            uVar28 = src[(long)iVar24 + local_b0];
            uVar5 = src[iVar24 + lVar23];
            uVar32 = src[(long)iVar24 + (long)iVar30];
            uVar18 = src[(long)(int)(uVar26 * srcWidth) + local_b0];
            uVar21 = src[(int)(uVar26 * srcWidth) + lVar23];
            if (((uVar15 == uVar40) && (uVar28 == uVar5)) ||
               ((uVar15 == uVar28 && (uVar40 == uVar5)))) {
              uVar38 = 0;
              uVar13 = 0;
            }
            else {
              dVar49 = 0.0;
              dVar50 = 0.0;
              if (uVar19 != uVar15) {
                dVar50 = (double)(int)((uVar19 >> 0x10 & 0xff) - (uVar15 >> 0x10 & 0xff));
                dVar51 = (double)(int)((uVar19 & 0xff) - (uVar15 & 0xff));
                dVar52 = dVar51 * 0.0722 +
                         (double)(int)((uVar19 >> 8 & 0xff) - (uVar15 >> 8 & 0xff)) * 0.7152 +
                         dVar50 * 0.2126;
                dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                dVar50 = (dVar50 - dVar52) * 0.63500127000254;
                dVar52 = dVar52 * cfg->luminanceWeight_;
                dVar50 = SQRT(dVar50 * dVar50 + dVar51 * dVar51 + dVar52 * dVar52);
              }
              if (uVar15 != uVar29) {
                dVar49 = (double)(int)((uVar15 >> 0x10 & 0xff) - (uVar29 >> 0x10 & 0xff));
                dVar51 = (double)(int)((uVar15 & 0xff) - (uVar29 & 0xff));
                dVar52 = dVar51 * 0.0722 +
                         (double)(int)((uVar15 >> 8 & 0xff) - (uVar29 >> 8 & 0xff)) * 0.7152 +
                         dVar49 * 0.2126;
                dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                dVar49 = (dVar49 - dVar52) * 0.63500127000254;
                dVar52 = dVar52 * cfg->luminanceWeight_;
                dVar49 = SQRT(dVar49 * dVar49 + dVar51 * dVar51 + dVar52 * dVar52);
              }
              dVar51 = 0.0;
              dVar52 = 0.0;
              if (uVar18 != uVar5) {
                dVar52 = (double)(int)((uVar18 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                dVar53 = (double)(int)((uVar18 & 0xff) - (uVar5 & 0xff));
                dVar55 = dVar53 * 0.0722 +
                         (double)(int)((uVar18 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152 +
                         dVar52 * 0.2126;
                dVar53 = (dVar53 - dVar55) * 0.5389092476826902;
                dVar52 = (dVar52 - dVar55) * 0.63500127000254;
                dVar55 = dVar55 * cfg->luminanceWeight_;
                dVar52 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar55 * dVar55);
              }
              if (uVar5 != uVar37) {
                dVar51 = (double)(int)((uVar5 >> 0x10 & 0xff) - (uVar37 >> 0x10 & 0xff));
                dVar53 = (double)(int)((uVar5 & 0xff) - (uVar37 & 0xff));
                dVar55 = dVar53 * 0.0722 +
                         (double)(int)((uVar5 >> 8 & 0xff) - (uVar37 >> 8 & 0xff)) * 0.7152 +
                         dVar51 * 0.2126;
                dVar53 = (dVar53 - dVar55) * 0.5389092476826902;
                dVar51 = (dVar51 - dVar55) * 0.63500127000254;
                dVar55 = dVar55 * cfg->luminanceWeight_;
                dVar51 = SQRT(dVar51 * dVar51 + dVar53 * dVar53 + dVar55 * dVar55);
              }
              dVar55 = 0.0;
              dVar53 = 0.0;
              if (uVar28 != uVar40) {
                dVar53 = (double)(int)((uVar28 >> 0x10 & 0xff) - (uVar40 >> 0x10 & 0xff));
                dVar56 = (double)(int)((uVar28 & 0xff) - (uVar40 & 0xff));
                dVar58 = dVar56 * 0.0722 +
                         (double)(int)((uVar28 >> 8 & 0xff) - (uVar40 >> 8 & 0xff)) * 0.7152 +
                         dVar53 * 0.2126;
                dVar56 = (dVar56 - dVar58) * 0.5389092476826902;
                dVar59 = dVar58 * cfg->luminanceWeight_;
                dVar53 = (dVar53 - dVar58) * 0.63500127000254;
                dVar53 = SQRT(dVar53 * dVar53 + dVar56 * dVar56 + dVar59 * dVar59) * 4.0;
              }
              if (uVar4 != uVar28) {
                dVar55 = (double)(int)((uVar4 >> 0x10 & 0xff) - (uVar28 >> 0x10 & 0xff));
                dVar56 = (double)(int)((uVar4 & 0xff) - (uVar28 & 0xff));
                dVar58 = dVar56 * 0.0722 +
                         (double)(int)((uVar4 >> 8 & 0xff) - (uVar28 >> 8 & 0xff)) * 0.7152 +
                         dVar55 * 0.2126;
                dVar56 = (dVar56 - dVar58) * 0.5389092476826902;
                dVar55 = (dVar55 - dVar58) * 0.63500127000254;
                dVar58 = dVar58 * cfg->luminanceWeight_;
                dVar55 = SQRT(dVar55 * dVar55 + dVar56 * dVar56 + dVar58 * dVar58);
              }
              dVar58 = 0.0;
              dVar56 = 0.0;
              if (uVar28 != uVar21) {
                dVar54 = (double)(int)((uVar28 >> 0x10 & 0xff) - (uVar21 >> 0x10 & 0xff));
                dVar56 = (double)(int)((uVar28 & 0xff) - (uVar21 & 0xff));
                dVar59 = dVar56 * 0.0722 +
                         (double)(int)((uVar28 >> 8 & 0xff) - (uVar21 >> 8 & 0xff)) * 0.7152 +
                         dVar54 * 0.2126;
                dVar56 = (dVar56 - dVar59) * 0.5389092476826902;
                dVar54 = (dVar54 - dVar59) * 0.63500127000254;
                dVar59 = dVar59 * cfg->luminanceWeight_;
                dVar56 = SQRT(dVar54 * dVar54 + dVar56 * dVar56 + dVar59 * dVar59);
              }
              if (uVar20 != uVar40) {
                dVar58 = (double)(int)((uVar20 >> 0x10 & 0xff) - (uVar40 >> 0x10 & 0xff));
                dVar59 = (double)(int)((uVar20 & 0xff) - (uVar40 & 0xff));
                dVar54 = dVar59 * 0.0722 +
                         (double)(int)((uVar20 >> 8 & 0xff) - (uVar40 >> 8 & 0xff)) * 0.7152 +
                         dVar58 * 0.2126;
                dVar59 = (dVar59 - dVar54) * 0.5389092476826902;
                dVar58 = (dVar58 - dVar54) * 0.63500127000254;
                dVar54 = dVar54 * cfg->luminanceWeight_;
                dVar58 = SQRT(dVar58 * dVar58 + dVar59 * dVar59 + dVar54 * dVar54);
              }
              dVar59 = 0.0;
              dVar54 = 0.0;
              if (uVar40 != uVar32) {
                dVar60 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar32 >> 0x10 & 0xff));
                dVar48 = (double)(int)((uVar40 & 0xff) - (uVar32 & 0xff));
                dVar54 = dVar48 * 0.0722 +
                         (double)(int)((uVar40 >> 8 & 0xff) - (uVar32 >> 8 & 0xff)) * 0.7152 +
                         dVar60 * 0.2126;
                dVar48 = (dVar48 - dVar54) * 0.5389092476826902;
                dVar60 = (dVar60 - dVar54) * 0.63500127000254;
                dVar54 = dVar54 * cfg->luminanceWeight_;
                dVar54 = SQRT(dVar60 * dVar60 + dVar48 * dVar48 + dVar54 * dVar54);
              }
              if (uVar15 != uVar5) {
                dVar57 = (double)(int)((uVar15 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                dVar59 = (double)(int)((uVar15 & 0xff) - (uVar5 & 0xff));
                dVar48 = dVar59 * 0.0722 +
                         (double)(int)((uVar15 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152 +
                         dVar57 * 0.2126;
                dVar59 = (dVar59 - dVar48) * 0.5389092476826902;
                dVar60 = dVar48 * cfg->luminanceWeight_;
                dVar48 = (dVar57 - dVar48) * 0.63500127000254;
                dVar59 = SQRT(dVar48 * dVar48 + dVar59 * dVar59 + dVar60 * dVar60) * 4.0;
              }
              dVar53 = dVar49 + dVar50 + dVar52 + dVar51 + dVar53;
              dVar59 = dVar56 + dVar55 + dVar58 + dVar54 + dVar59;
              if (dVar59 <= dVar53) {
                if (dVar53 <= dVar59) {
                  uVar38 = 0;
                  uVar13 = 0;
                }
                else {
                  dVar59 = dVar59 * cfg->dominantDirectionThreshold;
                  uVar38 = (ulong)(dVar59 < dVar53) + 1;
                  uVar13 = 0x100000000;
                  if (dVar59 < dVar53) {
                    uVar13 = 0x200000000;
                  }
                  if (uVar28 == uVar5) {
                    uVar38 = 0;
                  }
                  if (uVar15 == uVar28) {
                    uVar38 = 0;
                  }
                  if (uVar40 == uVar5) {
                    uVar13 = 0;
                  }
                  if (uVar15 == uVar40) {
                    uVar13 = 0;
                  }
                }
              }
              else {
                dVar53 = dVar53 * cfg->dominantDirectionThreshold;
                uVar13 = (ulong)(dVar53 < dVar59) + 1;
                uVar38 = 0x100000000;
                if (dVar53 < dVar59) {
                  uVar38 = 0x200000000;
                }
                if (uVar15 == uVar28) {
                  uVar13 = 0;
                }
                if (uVar15 == uVar40) {
                  uVar13 = 0;
                }
                if (uVar5 == uVar40) {
                  uVar38 = 0;
                }
                if (uVar5 == uVar28) {
                  uVar38 = 0;
                }
              }
            }
            bVar3 = *(byte *)((long)__s + local_b0);
            *(byte *)((long)__s + local_b0) = (char)uVar38 * '\x04' | (byte)local_80;
            if (uVar16 < __n) {
              *(byte *)((long)__s + uVar16) = *(byte *)((long)__s + uVar16) | (byte)(uVar13 >> 0x1a)
              ;
            }
            cVar8 = (char)uVar13;
            bVar9 = cVar8 << 4 | bVar3;
            local_80 = uVar38 >> 0x20;
            uVar20 = src[lVar22 + local_b0];
            iVar17 = 0;
            puVar34 = puVar46;
            do {
              lVar39 = 0;
              do {
                puVar34[lVar39] = uVar20;
                lVar39 = lVar39 + 1;
              } while (lVar39 != 3);
              iVar17 = iVar17 + 1;
              puVar34 = (uint *)((long)puVar34 + (long)(srcWidth * 0xc));
            } while (iVar17 != 3);
            if (bVar9 != 0) {
              uVar20 = src[(long)iVar10 + uVar41];
              uVar29 = src[(long)iVar10 + local_b0];
              uVar4 = src[iVar10 + lVar23];
              uVar15 = src[lVar22 + uVar41];
              uVar40 = src[lVar22 + local_b0];
              uVar37 = src[lVar22 + lVar23];
              uVar19 = src[(long)iVar24 + uVar41];
              uVar28 = src[(long)iVar24 + local_b0];
              uVar5 = src[iVar24 + lVar23];
              if (cVar8 != '\0' || (bVar3 & 0x30) != 0) {
                bVar47 = true;
                if ((bVar9 & 0x20) == 0) {
                  if ((bVar3 & 0xc) == 0) {
LAB_004187f4:
                    if (0x3f < bVar9) {
                      dVar50 = 0.0;
                      if (uVar40 != uVar4) {
                        dVar51 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff));
                        dVar50 = (double)(int)((uVar40 & 0xff) - (uVar4 & 0xff));
                        dVar49 = dVar50 * 0.0722 +
                                 (double)(int)((uVar40 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) * 0.7152
                                 + dVar51 * 0.2126;
                        dVar50 = (dVar50 - dVar49) * 0.5389092476826902;
                        dVar51 = (dVar51 - dVar49) * 0.63500127000254;
                        dVar49 = dVar49 * cfg->luminanceWeight_;
                        dVar50 = SQRT(dVar51 * dVar51 + dVar50 * dVar50 + dVar49 * dVar49);
                      }
                      if (cfg->equalColorTolerance_ <= dVar50) goto LAB_00418c4f;
                    }
                    dVar50 = 0.0;
                    if (uVar19 != uVar28) {
                      dVar51 = (double)(int)((uVar19 >> 0x10 & 0xff) - (uVar28 >> 0x10 & 0xff));
                      dVar50 = (double)(int)((uVar19 & 0xff) - (uVar28 & 0xff));
                      dVar49 = dVar50 * 0.0722 +
                               (double)(int)((uVar19 >> 8 & 0xff) - (uVar28 >> 8 & 0xff)) * 0.7152 +
                               dVar51 * 0.2126;
                      dVar50 = (dVar50 - dVar49) * 0.5389092476826902;
                      dVar51 = (dVar51 - dVar49) * 0.63500127000254;
                      dVar49 = dVar49 * cfg->luminanceWeight_;
                      dVar50 = SQRT(dVar51 * dVar51 + dVar50 * dVar50 + dVar49 * dVar49);
                    }
                    dVar49 = cfg->equalColorTolerance_;
                    if (dVar50 < dVar49) {
                      dVar50 = 0.0;
                      if (uVar28 != uVar5) {
                        dVar52 = (double)(int)((uVar28 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                        dVar50 = (double)(int)((uVar28 & 0xff) - (uVar5 & 0xff));
                        dVar51 = dVar50 * 0.0722 +
                                 (double)(int)((uVar28 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152
                                 + dVar52 * 0.2126;
                        dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                        dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                        dVar51 = dVar51 * cfg->luminanceWeight_;
                        dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                      }
                      if (dVar50 < dVar49) {
                        dVar50 = 0.0;
                        if (uVar5 != uVar37) {
                          dVar52 = (double)(int)((uVar5 >> 0x10 & 0xff) - (uVar37 >> 0x10 & 0xff));
                          dVar50 = (double)(int)((uVar5 & 0xff) - (uVar37 & 0xff));
                          dVar51 = dVar50 * 0.0722 +
                                   (double)(int)((uVar5 >> 8 & 0xff) - (uVar37 >> 8 & 0xff)) *
                                   0.7152 + dVar52 * 0.2126;
                          dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                          dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                          dVar51 = dVar51 * cfg->luminanceWeight_;
                          dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                        }
                        if (dVar50 < dVar49) {
                          dVar50 = 0.0;
                          if (uVar37 != uVar4) {
                            dVar52 = (double)(int)((uVar37 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff))
                            ;
                            dVar50 = (double)(int)((uVar37 & 0xff) - (uVar4 & 0xff));
                            dVar51 = dVar50 * 0.0722 +
                                     (double)(int)((uVar37 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) *
                                     0.7152 + dVar52 * 0.2126;
                            dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                            dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                            dVar51 = dVar51 * cfg->luminanceWeight_;
                            dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                          }
                          if (dVar50 < dVar49) {
                            dVar50 = 0.0;
                            if (uVar40 != uVar5) {
                              dVar52 = (double)(int)((uVar40 >> 0x10 & 0xff) -
                                                    (uVar5 >> 0x10 & 0xff));
                              dVar50 = (double)(int)((uVar40 & 0xff) - (uVar5 & 0xff));
                              dVar51 = dVar50 * 0.0722 +
                                       (double)(int)((uVar40 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) *
                                       0.7152 + dVar52 * 0.2126;
                              dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                              dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                              dVar51 = dVar51 * cfg->luminanceWeight_;
                              dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                            }
                            if (dVar49 <= dVar50) goto LAB_00418c4f;
                          }
                        }
                      }
                    }
                  }
                  else {
                    dVar50 = 0.0;
                    if (uVar40 != uVar19) {
                      dVar51 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar19 >> 0x10 & 0xff));
                      dVar50 = (double)(int)((uVar40 & 0xff) - (uVar19 & 0xff));
                      dVar49 = dVar50 * 0.0722 +
                               (double)(int)((uVar40 >> 8 & 0xff) - (uVar19 >> 8 & 0xff)) * 0.7152 +
                               dVar51 * 0.2126;
                      dVar50 = (dVar50 - dVar49) * 0.5389092476826902;
                      dVar51 = (dVar51 - dVar49) * 0.63500127000254;
                      dVar49 = dVar49 * cfg->luminanceWeight_;
                      dVar50 = SQRT(dVar51 * dVar51 + dVar50 * dVar50 + dVar49 * dVar49);
                    }
                    if (dVar50 < cfg->equalColorTolerance_) goto LAB_004187f4;
LAB_00418c4f:
                    bVar47 = false;
                  }
                }
                dVar50 = 0.0;
                dVar49 = 0.0;
                if (uVar40 != uVar37) {
                  dVar52 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar37 >> 0x10 & 0xff));
                  dVar49 = (double)(int)((uVar40 & 0xff) - (uVar37 & 0xff));
                  dVar51 = dVar49 * 0.0722 +
                           (double)(int)((uVar40 >> 8 & 0xff) - (uVar37 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar49 = (dVar49 - dVar51) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                  dVar51 = dVar51 * cfg->luminanceWeight_;
                  dVar49 = SQRT(dVar52 * dVar52 + dVar49 * dVar49 + dVar51 * dVar51);
                }
                if (uVar40 != uVar28) {
                  dVar52 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar28 >> 0x10 & 0xff));
                  dVar50 = (double)(int)((uVar40 & 0xff) - (uVar28 & 0xff));
                  dVar51 = dVar50 * 0.0722 +
                           (double)(int)((uVar40 >> 8 & 0xff) - (uVar28 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                  dVar51 = dVar51 * cfg->luminanceWeight_;
                  dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                }
                uVar32 = uVar37;
                if (dVar50 < dVar49) {
                  uVar32 = uVar28;
                }
                if (bVar47) {
                  dVar50 = 0.0;
                  dVar49 = 0.0;
                  if (uVar37 != uVar19) {
                    dVar52 = (double)(int)((uVar37 >> 0x10 & 0xff) - (uVar19 >> 0x10 & 0xff));
                    dVar49 = (double)(int)((uVar37 & 0xff) - (uVar19 & 0xff));
                    dVar51 = dVar49 * 0.0722 +
                             (double)(int)((uVar37 >> 8 & 0xff) - (uVar19 >> 8 & 0xff)) * 0.7152 +
                             dVar52 * 0.2126;
                    dVar49 = (dVar49 - dVar51) * 0.5389092476826902;
                    dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                    dVar51 = dVar51 * cfg->luminanceWeight_;
                    dVar49 = SQRT(dVar52 * dVar52 + dVar49 * dVar49 + dVar51 * dVar51);
                  }
                  if (uVar28 != uVar4) {
                    dVar52 = (double)(int)((uVar28 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff));
                    dVar50 = (double)(int)((uVar28 & 0xff) - (uVar4 & 0xff));
                    dVar51 = dVar50 * 0.0722 +
                             (double)(int)((uVar28 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) * 0.7152 +
                             dVar52 * 0.2126;
                    dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                    dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                    dVar51 = dVar51 * cfg->luminanceWeight_;
                    dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                  }
                  bVar47 = dVar49 < cfg->steepDirectionThreshold * dVar50;
                  if (((dVar50 < cfg->steepDirectionThreshold * dVar49) || (uVar40 == uVar19)) ||
                     (uVar15 == uVar19)) {
                    if ((uVar29 != uVar4 && uVar40 != uVar4) && !bVar47) {
                      uVar44 = uVar32 >> 0x18;
                      uVar18 = puVar46[2];
                      uVar31 = ((uVar18 >> 0x18) * 3 + uVar44 & 0xfffffffc) << 0x16;
                      uVar21 = uVar31;
                      if (uVar18 >> 0x18 == 0xff) {
                        uVar21 = 0xff000000;
                      }
                      if (uVar44 != 0xff) {
                        uVar21 = uVar31;
                      }
                      uVar36 = uVar32 & 0xff0000;
                      uVar31 = uVar32 & 0xff00;
                      uVar42 = uVar32 & 0xff;
                      puVar46[2] = (uVar18 & 0xff) * 3 + uVar42 >> 2 & 0xff |
                                   (uVar18 & 0xff00) * 3 + uVar31 >> 2 & 0xff00 |
                                   (uVar18 & 0xff0000) * 3 + uVar36 >> 2 & 0xff0000 | uVar21;
                      uVar18 = puVar46[uVar12 * 2 + 1];
                      uVar35 = ((uVar18 >> 0x18) * 3 + uVar44 & 0xfffffffc) << 0x16;
                      uVar21 = uVar35;
                      if (uVar18 >> 0x18 == 0xff) {
                        uVar21 = 0xff000000;
                      }
                      if (uVar44 != 0xff) {
                        uVar21 = uVar35;
                      }
                      puVar46[uVar12 * 2 + 1] =
                           (uVar18 & 0xff) * 3 + uVar42 >> 2 & 0xff |
                           (uVar18 & 0xff00) * 3 + uVar31 >> 2 & 0xff00 |
                           (uVar18 & 0xff0000) * 3 + uVar36 >> 2 & 0xff0000 | uVar21;
                      uVar18 = puVar46[uVar12 + 2];
                      uVar35 = (uVar44 * 3 + (uVar18 >> 0x18) & 0xfffffffc) << 0x16;
                      uVar21 = uVar35;
                      if (uVar18 >> 0x18 == 0xff) {
                        uVar21 = 0xff000000;
                      }
                      if (uVar44 != 0xff) {
                        uVar21 = uVar35;
                      }
                      puVar46[uVar12 + 2] =
                           (uVar18 & 0xff) + uVar42 * 3 >> 2 & 0xff |
                           (uVar18 & 0xff00) + uVar31 * 3 >> 2 & 0xff00 |
                           (uVar18 & 0xff0000) + uVar36 * 3 >> 2 & 0xff0000 | uVar21;
                      goto LAB_00419799;
                    }
                    uVar44 = uVar32 >> 0x18;
                    uVar18 = puVar46[uVar12 + 2];
                    uVar31 = ((uVar18 >> 0x18) * 7 + uVar44 & 0xfffffff8) << 0x15;
                    uVar21 = uVar31;
                    if (uVar18 >> 0x18 == 0xff) {
                      uVar21 = 0xff000000;
                    }
                    if (uVar44 != 0xff) {
                      uVar21 = uVar31;
                    }
                    uVar31 = uVar32 & 0xff0000;
                    uVar36 = uVar32 & 0xff00;
                    uVar42 = uVar32 & 0xff;
                    puVar46[uVar12 + 2] =
                         (uVar18 * 8 - (uVar18 & 0xff)) + uVar42 >> 3 & 0xff |
                         (uVar18 & 0xff00) * 7 + uVar36 >> 3 & 0xff00 |
                         (uVar18 & 0xff0000) * 7 + uVar31 >> 3 & 0xff0000 | uVar21;
                    uVar18 = puVar46[uVar12 * 2 + 2];
                    uVar35 = (uVar44 * 7 + (uVar18 >> 0x18) & 0xfffffff8) << 0x15;
                    uVar21 = uVar35;
                    if (uVar18 >> 0x18 == 0xff) {
                      uVar21 = 0xff000000;
                    }
                    if (uVar44 != 0xff) {
                      uVar21 = uVar35;
                    }
                    uVar35 = puVar46[uVar12 * 2 + 1];
                    uVar43 = ((uVar35 >> 0x18) * 7 + uVar44 & 0xfffffff8) << 0x15;
                    uVar33 = uVar43;
                    if (uVar35 >> 0x18 == 0xff) {
                      uVar33 = 0xff000000;
                    }
                    if (uVar44 != 0xff) {
                      uVar33 = uVar43;
                    }
                    puVar46[uVar12 * 2 + 1] =
                         (uVar35 * 8 - (uVar35 & 0xff)) + uVar42 >> 3 & 0xff |
                         (uVar35 & 0xff00) * 7 + uVar36 >> 3 & 0xff00 |
                         (uVar35 & 0xff0000) * 7 + uVar31 >> 3 & 0xff0000 | uVar33;
                    puVar46[uVar12 * 2 + 2] =
                         (uVar18 & 0xff) + (uVar32 * 8 - uVar42) >> 3 & 0xff |
                         (uVar18 & 0xff00) + uVar36 * 7 >> 3 & 0xff00 |
                         (uVar18 & 0xff0000) + uVar31 * 7 >> 3 & 0xff0000 | uVar21;
                  }
                  else {
                    uVar18 = uVar32 >> 0x18;
                    uVar44 = uVar32 & 0xff0000;
                    uVar21 = uVar32 & 0xff00;
                    if ((uVar29 == uVar4 || uVar40 == uVar4) || bVar47) {
                      uVar31 = puVar46[uVar12 * 2];
                      uVar35 = ((uVar31 >> 0x18) * 3 + uVar18 & 0xfffffffc) << 0x16;
                      uVar36 = uVar35;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar35;
                      }
                      uVar35 = uVar32 & 0xff;
                      puVar46[uVar12 * 2] =
                           (uVar31 & 0xff) * 3 + uVar35 >> 2 & 0xff |
                           (uVar31 & 0xff00) * 3 + uVar21 >> 2 & 0xff00 |
                           (uVar31 & 0xff0000) * 3 + uVar44 >> 2 & 0xff0000 | uVar36;
                      uVar31 = puVar46[uVar12 + 2];
                      uVar42 = ((uVar31 >> 0x18) * 3 + uVar18 & 0xfffffffc) << 0x16;
                      uVar36 = uVar42;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar42;
                      }
                      puVar46[uVar12 + 2] =
                           (uVar31 & 0xff) * 3 + uVar35 >> 2 & 0xff |
                           (uVar31 & 0xff00) * 3 + uVar21 >> 2 & 0xff00 |
                           (uVar31 & 0xff0000) * 3 + uVar44 >> 2 & 0xff0000 | uVar36;
                      uVar31 = puVar46[uVar12 * 2 + 1];
                      uVar42 = (uVar18 * 3 + (uVar31 >> 0x18) & 0xfffffffc) << 0x16;
                      uVar36 = uVar42;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar42;
                      }
                      puVar46[uVar12 * 2 + 1] =
                           (uVar31 & 0xff) + uVar35 * 3 >> 2 & 0xff |
                           (uVar31 & 0xff00) + uVar21 * 3 >> 2 & 0xff00 |
                           (uVar31 & 0xff0000) + uVar44 * 3 >> 2 & 0xff0000 | uVar36;
LAB_00419799:
                      puVar46[uVar12 * 2 + 2] = uVar32;
                    }
                    else {
                      uVar31 = puVar46[uVar12 * 2];
                      uVar35 = ((uVar31 >> 0x18) * 3 + uVar18 & 0xfffffffc) << 0x16;
                      uVar36 = uVar35;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar35;
                      }
                      uVar35 = uVar32 & 0xff;
                      puVar46[uVar12 * 2] =
                           (uVar31 & 0xff) * 3 + uVar35 >> 2 & 0xff |
                           (uVar31 & 0xff00) * 3 + uVar21 >> 2 & 0xff00 |
                           (uVar31 & 0xff0000) * 3 + uVar44 >> 2 & 0xff0000 | uVar36;
                      uVar31 = puVar46[2];
                      uVar42 = ((uVar31 >> 0x18) * 3 + uVar18 & 0xfffffffc) << 0x16;
                      uVar36 = uVar42;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar42;
                      }
                      puVar46[2] = (uVar31 & 0xff) * 3 + uVar35 >> 2 & 0xff |
                                   (uVar31 & 0xff00) * 3 + uVar21 >> 2 & 0xff00 |
                                   (uVar31 & 0xff0000) * 3 + uVar44 >> 2 & 0xff0000 | uVar36;
                      uVar31 = puVar46[uVar12 * 2 + 1];
                      uVar42 = ((uVar31 >> 0x18) + uVar18 * 3 & 0xfffffffc) << 0x16;
                      uVar36 = uVar42;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar42;
                      }
                      puVar46[uVar12 * 2 + 1] =
                           (uVar31 & 0xff) + uVar35 * 3 >> 2 & 0xff |
                           (uVar31 & 0xff00) + uVar21 * 3 >> 2 & 0xff00 |
                           (uVar31 & 0xff0000) + uVar44 * 3 >> 2 & 0xff0000 | uVar36;
                      uVar31 = puVar46[uVar12 + 2];
                      uVar42 = (uVar18 * 3 + (uVar31 >> 0x18) & 0xfffffffc) << 0x16;
                      uVar36 = uVar42;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar42;
                      }
                      puVar46[uVar12 + 2] =
                           (uVar31 & 0xff) + uVar35 * 3 >> 2 & 0xff |
                           (uVar31 & 0xff00) + uVar21 * 3 >> 2 & 0xff00 |
                           (uVar31 & 0xff0000) + uVar44 * 3 >> 2 & 0xff0000 | uVar36;
                      puVar46[uVar12 * 2 + 2] = uVar32;
                    }
                  }
                }
                else {
                  uVar18 = puVar46[uVar12 * 2 + 2];
                  if ((uVar32 >> 0x18 != 0xff) || (uVar21 = 0xff000000, uVar18 >> 0x18 != 0xff)) {
                    uVar21 = ((uVar18 >> 0x18) * 0x37 + (uVar32 >> 0x18) * 0x2d) / 100 << 0x18;
                  }
                  puVar46[uVar12 * 2 + 2] =
                       ((uVar18 & 0xff) * 0x37 + (uVar32 & 0xff) * 0x2d) / 100 & 0xff |
                       ((uVar18 & 0xff00) * 0x37 + (uVar32 & 0xff00) * 0x2d) / 100 & 0xff00 |
                       ((uVar18 & 0xff0000) * 0x37 + (uVar32 & 0xff0000) * 0x2d) / 100 & 0xff0000 |
                       uVar21;
                }
              }
              if ((bVar3 & 0xc) != 0) {
                bVar47 = true;
                if ((bVar3 & 8) == 0) {
                  if ((bVar3 & 3) == 0) {
LAB_0041988b:
                    if (0x3f < (byte)(bVar9 << 2 | bVar3 >> 6)) {
                      dVar50 = 0.0;
                      if (uVar40 != uVar20) {
                        dVar51 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar20 >> 0x10 & 0xff));
                        dVar50 = (double)(int)((uVar40 & 0xff) - (uVar20 & 0xff));
                        dVar49 = dVar50 * 0.0722 +
                                 (double)(int)((uVar40 >> 8 & 0xff) - (uVar20 >> 8 & 0xff)) * 0.7152
                                 + dVar51 * 0.2126;
                        dVar50 = (dVar50 - dVar49) * 0.5389092476826902;
                        dVar51 = (dVar51 - dVar49) * 0.63500127000254;
                        dVar49 = dVar49 * cfg->luminanceWeight_;
                        dVar50 = SQRT(dVar51 * dVar51 + dVar50 * dVar50 + dVar49 * dVar49);
                      }
                      if (cfg->equalColorTolerance_ <= dVar50) goto LAB_00419cd5;
                    }
                    dVar50 = 0.0;
                    if (uVar5 != uVar37) {
                      dVar51 = (double)(int)((uVar5 >> 0x10 & 0xff) - (uVar37 >> 0x10 & 0xff));
                      dVar50 = (double)(int)((uVar5 & 0xff) - (uVar37 & 0xff));
                      dVar49 = dVar50 * 0.0722 +
                               (double)(int)((uVar5 >> 8 & 0xff) - (uVar37 >> 8 & 0xff)) * 0.7152 +
                               dVar51 * 0.2126;
                      dVar50 = (dVar50 - dVar49) * 0.5389092476826902;
                      dVar51 = (dVar51 - dVar49) * 0.63500127000254;
                      dVar49 = dVar49 * cfg->luminanceWeight_;
                      dVar50 = SQRT(dVar51 * dVar51 + dVar50 * dVar50 + dVar49 * dVar49);
                    }
                    dVar49 = cfg->equalColorTolerance_;
                    if (dVar50 < dVar49) {
                      dVar50 = 0.0;
                      if (uVar37 != uVar4) {
                        dVar52 = (double)(int)((uVar37 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff));
                        dVar50 = (double)(int)((uVar37 & 0xff) - (uVar4 & 0xff));
                        dVar51 = dVar50 * 0.0722 +
                                 (double)(int)((uVar37 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) * 0.7152
                                 + dVar52 * 0.2126;
                        dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                        dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                        dVar51 = dVar51 * cfg->luminanceWeight_;
                        dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                      }
                      if (dVar50 < dVar49) {
                        dVar50 = 0.0;
                        if (uVar4 != uVar29) {
                          dVar52 = (double)(int)((uVar4 >> 0x10 & 0xff) - (uVar29 >> 0x10 & 0xff));
                          dVar50 = (double)(int)((uVar4 & 0xff) - (uVar29 & 0xff));
                          dVar51 = dVar50 * 0.0722 +
                                   (double)(int)((uVar4 >> 8 & 0xff) - (uVar29 >> 8 & 0xff)) *
                                   0.7152 + dVar52 * 0.2126;
                          dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                          dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                          dVar51 = dVar51 * cfg->luminanceWeight_;
                          dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                        }
                        if (dVar50 < dVar49) {
                          dVar50 = 0.0;
                          if (uVar29 != uVar20) {
                            dVar52 = (double)(int)((uVar29 >> 0x10 & 0xff) - (uVar20 >> 0x10 & 0xff)
                                                  );
                            dVar50 = (double)(int)((uVar29 & 0xff) - (uVar20 & 0xff));
                            dVar51 = dVar50 * 0.0722 +
                                     (double)(int)((uVar29 >> 8 & 0xff) - (uVar20 >> 8 & 0xff)) *
                                     0.7152 + dVar52 * 0.2126;
                            dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                            dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                            dVar51 = dVar51 * cfg->luminanceWeight_;
                            dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                          }
                          if (dVar50 < dVar49) {
                            dVar50 = 0.0;
                            if (uVar40 != uVar4) {
                              dVar52 = (double)(int)((uVar40 >> 0x10 & 0xff) -
                                                    (uVar4 >> 0x10 & 0xff));
                              dVar50 = (double)(int)((uVar40 & 0xff) - (uVar4 & 0xff));
                              dVar51 = dVar50 * 0.0722 +
                                       (double)(int)((uVar40 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) *
                                       0.7152 + dVar52 * 0.2126;
                              dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                              dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                              dVar51 = dVar51 * cfg->luminanceWeight_;
                              dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                            }
                            if (dVar49 <= dVar50) goto LAB_00419cd5;
                          }
                        }
                      }
                    }
                  }
                  else {
                    dVar50 = 0.0;
                    if (uVar40 != uVar5) {
                      dVar51 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                      dVar50 = (double)(int)((uVar40 & 0xff) - (uVar5 & 0xff));
                      dVar49 = dVar50 * 0.0722 +
                               (double)(int)((uVar40 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152 +
                               dVar51 * 0.2126;
                      dVar50 = (dVar50 - dVar49) * 0.5389092476826902;
                      dVar51 = (dVar51 - dVar49) * 0.63500127000254;
                      dVar49 = dVar49 * cfg->luminanceWeight_;
                      dVar50 = SQRT(dVar51 * dVar51 + dVar50 * dVar50 + dVar49 * dVar49);
                    }
                    if (dVar50 < cfg->equalColorTolerance_) goto LAB_0041988b;
LAB_00419cd5:
                    bVar47 = false;
                  }
                }
                dVar50 = 0.0;
                dVar49 = 0.0;
                if (uVar40 != uVar29) {
                  dVar52 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar29 >> 0x10 & 0xff));
                  dVar49 = (double)(int)((uVar40 & 0xff) - (uVar29 & 0xff));
                  dVar51 = dVar49 * 0.0722 +
                           (double)(int)((uVar40 >> 8 & 0xff) - (uVar29 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar49 = (dVar49 - dVar51) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                  dVar51 = dVar51 * cfg->luminanceWeight_;
                  dVar49 = SQRT(dVar52 * dVar52 + dVar49 * dVar49 + dVar51 * dVar51);
                }
                if (uVar40 != uVar37) {
                  dVar52 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar37 >> 0x10 & 0xff));
                  dVar50 = (double)(int)((uVar40 & 0xff) - (uVar37 & 0xff));
                  dVar51 = dVar50 * 0.0722 +
                           (double)(int)((uVar40 >> 8 & 0xff) - (uVar37 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                  dVar51 = dVar51 * cfg->luminanceWeight_;
                  dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                }
                uVar32 = uVar29;
                if (dVar50 < dVar49) {
                  uVar32 = uVar37;
                }
                if (bVar47) {
                  dVar50 = 0.0;
                  dVar49 = 0.0;
                  if (uVar29 != uVar5) {
                    dVar52 = (double)(int)((uVar29 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                    dVar49 = (double)(int)((uVar29 & 0xff) - (uVar5 & 0xff));
                    dVar51 = dVar49 * 0.0722 +
                             (double)(int)((uVar29 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152 +
                             dVar52 * 0.2126;
                    dVar49 = (dVar49 - dVar51) * 0.5389092476826902;
                    dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                    dVar51 = dVar51 * cfg->luminanceWeight_;
                    dVar49 = SQRT(dVar52 * dVar52 + dVar49 * dVar49 + dVar51 * dVar51);
                  }
                  if (uVar37 != uVar20) {
                    dVar52 = (double)(int)((uVar37 >> 0x10 & 0xff) - (uVar20 >> 0x10 & 0xff));
                    dVar50 = (double)(int)((uVar37 & 0xff) - (uVar20 & 0xff));
                    dVar51 = dVar50 * 0.0722 +
                             (double)(int)((uVar37 >> 8 & 0xff) - (uVar20 >> 8 & 0xff)) * 0.7152 +
                             dVar52 * 0.2126;
                    dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                    dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                    dVar51 = dVar51 * cfg->luminanceWeight_;
                    dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                  }
                  bVar47 = dVar49 < cfg->steepDirectionThreshold * dVar50;
                  if (((dVar50 < cfg->steepDirectionThreshold * dVar49) || (uVar40 == uVar5)) ||
                     (uVar28 == uVar5)) {
                    uVar18 = uVar32 >> 0x18;
                    if ((uVar15 != uVar20 && uVar40 != uVar20) && !bVar47) {
                      uVar21 = *puVar46;
                      uVar31 = ((uVar21 >> 0x18) * 3 + uVar18 & 0xfffffffc) << 0x16;
                      uVar44 = uVar31;
                      if (uVar21 >> 0x18 == 0xff) {
                        uVar44 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar44 = uVar31;
                      }
                      uVar35 = uVar32 & 0xff0000;
                      uVar31 = uVar32 & 0xff00;
                      uVar42 = uVar32 & 0xff;
                      *puVar46 = (uVar21 & 0xff) * 3 + uVar42 >> 2 & 0xff |
                                 (uVar21 & 0xff00) * 3 + uVar31 >> 2 & 0xff00 |
                                 (uVar21 & 0xff0000) * 3 + uVar35 >> 2 & 0xff0000 | uVar44;
                      uVar21 = puVar46[uVar12 + 2];
                      uVar36 = ((uVar21 >> 0x18) * 3 + uVar18 & 0xfffffffc) << 0x16;
                      uVar44 = uVar36;
                      if (uVar21 >> 0x18 == 0xff) {
                        uVar44 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar44 = uVar36;
                      }
                      puVar46[uVar12 + 2] =
                           (uVar21 & 0xff) * 3 + uVar42 >> 2 & 0xff |
                           (uVar21 & 0xff00) * 3 + uVar31 >> 2 & 0xff00 |
                           (uVar21 & 0xff0000) * 3 + uVar35 >> 2 & 0xff0000 | uVar44;
                      uVar21 = puVar46[1];
                      uVar36 = (uVar18 * 3 + (uVar21 >> 0x18) & 0xfffffffc) << 0x16;
                      uVar44 = uVar36;
                      if (uVar21 >> 0x18 == 0xff) {
                        uVar44 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar44 = uVar36;
                      }
                      puVar46[1] = (uVar21 & 0xff) + uVar42 * 3 >> 2 & 0xff |
                                   (uVar21 & 0xff00) + uVar31 * 3 >> 2 & 0xff00 |
                                   (uVar21 & 0xff0000) + uVar35 * 3 >> 2 & 0xff0000 | uVar44;
                      goto LAB_0041a483;
                    }
                    uVar21 = puVar46[1];
                    uVar31 = ((uVar21 >> 0x18) * 7 + uVar18 & 0xfffffff8) << 0x15;
                    uVar44 = uVar31;
                    if (uVar21 >> 0x18 == 0xff) {
                      uVar44 = 0xff000000;
                    }
                    if (uVar18 != 0xff) {
                      uVar44 = uVar31;
                    }
                    uVar35 = uVar32 & 0xff0000;
                    uVar42 = uVar32 & 0xff00;
                    uVar31 = uVar32 & 0xff;
                    puVar46[1] = (uVar21 * 8 - (uVar21 & 0xff)) + uVar31 >> 3 & 0xff |
                                 (uVar21 & 0xff00) * 7 + uVar42 >> 3 & 0xff00 |
                                 (uVar21 & 0xff0000) * 7 + uVar35 >> 3 & 0xff0000 | uVar44;
                    uVar21 = puVar46[uVar12 + 2];
                    uVar36 = ((uVar21 >> 0x18) * 7 + uVar18 & 0xfffffff8) << 0x15;
                    uVar44 = uVar36;
                    if (uVar21 >> 0x18 == 0xff) {
                      uVar44 = 0xff000000;
                    }
                    if (uVar18 != 0xff) {
                      uVar44 = uVar36;
                    }
                    puVar46[uVar12 + 2] =
                         (uVar21 * 8 - (uVar21 & 0xff)) + uVar31 >> 3 & 0xff |
                         (uVar21 & 0xff00) * 7 + uVar42 >> 3 & 0xff00 |
                         (uVar21 & 0xff0000) * 7 + uVar35 >> 3 & 0xff0000 | uVar44;
                    uVar21 = puVar46[2];
                    uVar36 = (uVar18 * 7 + (uVar21 >> 0x18) & 0xfffffff8) << 0x15;
                    uVar44 = uVar36;
                    if (uVar21 >> 0x18 == 0xff) {
                      uVar44 = 0xff000000;
                    }
                    if (uVar18 != 0xff) {
                      uVar44 = uVar36;
                    }
                    puVar46[2] = (uVar21 & 0xff) + (uVar32 * 8 - uVar31) >> 3 & 0xff |
                                 (uVar21 & 0xff00) + uVar42 * 7 >> 3 & 0xff00 |
                                 (uVar21 & 0xff0000) + uVar35 * 7 >> 3 & 0xff0000 | uVar44;
                  }
                  else {
                    uVar18 = uVar32 >> 0x18;
                    uVar44 = uVar32 & 0xff0000;
                    uVar21 = uVar32 & 0xff00;
                    if ((uVar15 == uVar20 || uVar40 == uVar20) || bVar47) {
                      uVar31 = puVar46[uVar12 * 2 + 2];
                      uVar35 = ((uVar31 >> 0x18) * 3 + uVar18 & 0xfffffffc) << 0x16;
                      uVar36 = uVar35;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar35;
                      }
                      uVar42 = uVar32 & 0xff;
                      puVar46[uVar12 * 2 + 2] =
                           (uVar31 & 0xff) * 3 + uVar42 >> 2 & 0xff |
                           (uVar31 & 0xff00) * 3 + uVar21 >> 2 & 0xff00 |
                           (uVar31 & 0xff0000) * 3 + uVar44 >> 2 & 0xff0000 | uVar36;
                      uVar31 = puVar46[1];
                      uVar35 = ((uVar31 >> 0x18) * 3 + uVar18 & 0xfffffffc) << 0x16;
                      uVar36 = uVar35;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar35;
                      }
                      puVar46[1] = (uVar31 & 0xff) * 3 + uVar42 >> 2 & 0xff |
                                   (uVar31 & 0xff00) * 3 + uVar21 >> 2 & 0xff00 |
                                   (uVar31 & 0xff0000) * 3 + uVar44 >> 2 & 0xff0000 | uVar36;
                      uVar31 = puVar46[uVar12 + 2];
                      uVar35 = (uVar18 * 3 + (uVar31 >> 0x18) & 0xfffffffc) << 0x16;
                      uVar36 = uVar35;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar35;
                      }
                      puVar46[uVar12 + 2] =
                           (uVar31 & 0xff) + uVar42 * 3 >> 2 & 0xff |
                           (uVar31 & 0xff00) + uVar21 * 3 >> 2 & 0xff00 |
                           (uVar31 & 0xff0000) + uVar44 * 3 >> 2 & 0xff0000 | uVar36;
                      puVar46[2] = uVar32;
                    }
                    else {
                      uVar31 = puVar46[uVar12 * 2 + 2];
                      uVar35 = ((uVar31 >> 0x18) * 3 + uVar18 & 0xfffffffc) << 0x16;
                      uVar36 = uVar35;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar35;
                      }
                      uVar42 = uVar32 & 0xff;
                      puVar46[uVar12 * 2 + 2] =
                           (uVar31 & 0xff) * 3 + uVar42 >> 2 & 0xff |
                           (uVar31 & 0xff00) * 3 + uVar21 >> 2 & 0xff00 |
                           (uVar31 & 0xff0000) * 3 + uVar44 >> 2 & 0xff0000 | uVar36;
                      uVar31 = *puVar46;
                      uVar35 = ((uVar31 >> 0x18) * 3 + uVar18 & 0xfffffffc) << 0x16;
                      uVar36 = uVar35;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar35;
                      }
                      *puVar46 = (uVar31 & 0xff) * 3 + uVar42 >> 2 & 0xff |
                                 (uVar31 & 0xff00) * 3 + uVar21 >> 2 & 0xff00 |
                                 (uVar31 & 0xff0000) * 3 + uVar44 >> 2 & 0xff0000 | uVar36;
                      uVar31 = puVar46[uVar12 + 2];
                      uVar35 = ((uVar31 >> 0x18) + uVar18 * 3 & 0xfffffffc) << 0x16;
                      uVar36 = uVar35;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar35;
                      }
                      puVar46[uVar12 + 2] =
                           (uVar31 & 0xff) + uVar42 * 3 >> 2 & 0xff |
                           (uVar31 & 0xff00) + uVar21 * 3 >> 2 & 0xff00 |
                           (uVar31 & 0xff0000) + uVar44 * 3 >> 2 & 0xff0000 | uVar36;
                      uVar31 = puVar46[1];
                      uVar35 = (uVar18 * 3 + (uVar31 >> 0x18) & 0xfffffffc) << 0x16;
                      uVar36 = uVar35;
                      if (uVar31 >> 0x18 == 0xff) {
                        uVar36 = 0xff000000;
                      }
                      if (uVar18 != 0xff) {
                        uVar36 = uVar35;
                      }
                      puVar46[1] = (uVar31 & 0xff) + uVar42 * 3 >> 2 & 0xff |
                                   (uVar31 & 0xff00) + uVar21 * 3 >> 2 & 0xff00 |
                                   (uVar31 & 0xff0000) + uVar44 * 3 >> 2 & 0xff0000 | uVar36;
LAB_0041a483:
                      puVar46[2] = uVar32;
                    }
                  }
                }
                else {
                  uVar18 = puVar46[2];
                  if ((uVar32 >> 0x18 != 0xff) || (uVar21 = 0xff000000, uVar18 >> 0x18 != 0xff)) {
                    uVar21 = ((uVar18 >> 0x18) * 0x37 + (uVar32 >> 0x18) * 0x2d) / 100 << 0x18;
                  }
                  puVar46[2] = ((uVar18 & 0xff) * 0x37 + (uVar32 & 0xff) * 0x2d) / 100 & 0xff |
                               ((uVar18 & 0xff00) * 0x37 + (uVar32 & 0xff00) * 0x2d) / 100 & 0xff00
                               | ((uVar18 & 0xff0000) * 0x37 + (uVar32 & 0xff0000) * 0x2d) / 100 &
                                 0xff0000 | uVar21;
                }
              }
              bVar6 = bVar3 << 4;
              if ((bVar6 & 0x30) != 0) {
                bVar47 = true;
                if ((bVar6 & 0x20) == 0) {
                  if ((bVar3 & 0xc0) == 0) {
LAB_0041a90c:
                    if (0x3f < (byte)(bVar6 | bVar9 >> 4)) {
                      dVar50 = 0.0;
                      if (uVar40 != uVar19) {
                        dVar51 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar19 >> 0x10 & 0xff));
                        dVar50 = (double)(int)((uVar40 & 0xff) - (uVar19 & 0xff));
                        dVar49 = dVar50 * 0.0722 +
                                 (double)(int)((uVar40 >> 8 & 0xff) - (uVar19 >> 8 & 0xff)) * 0.7152
                                 + dVar51 * 0.2126;
                        dVar50 = (dVar50 - dVar49) * 0.5389092476826902;
                        dVar51 = (dVar51 - dVar49) * 0.63500127000254;
                        dVar49 = dVar49 * cfg->luminanceWeight_;
                        dVar50 = SQRT(dVar51 * dVar51 + dVar50 * dVar50 + dVar49 * dVar49);
                      }
                      if (cfg->equalColorTolerance_ <= dVar50) goto LAB_0041ad5b;
                    }
                    dVar50 = 0.0;
                    if (uVar4 != uVar29) {
                      dVar51 = (double)(int)((uVar4 >> 0x10 & 0xff) - (uVar29 >> 0x10 & 0xff));
                      dVar50 = (double)(int)((uVar4 & 0xff) - (uVar29 & 0xff));
                      dVar49 = dVar50 * 0.0722 +
                               (double)(int)((uVar4 >> 8 & 0xff) - (uVar29 >> 8 & 0xff)) * 0.7152 +
                               dVar51 * 0.2126;
                      dVar50 = (dVar50 - dVar49) * 0.5389092476826902;
                      dVar51 = (dVar51 - dVar49) * 0.63500127000254;
                      dVar49 = dVar49 * cfg->luminanceWeight_;
                      dVar50 = SQRT(dVar51 * dVar51 + dVar50 * dVar50 + dVar49 * dVar49);
                    }
                    dVar49 = cfg->equalColorTolerance_;
                    if (dVar50 < dVar49) {
                      dVar50 = 0.0;
                      if (uVar29 != uVar20) {
                        dVar52 = (double)(int)((uVar29 >> 0x10 & 0xff) - (uVar20 >> 0x10 & 0xff));
                        dVar50 = (double)(int)((uVar29 & 0xff) - (uVar20 & 0xff));
                        dVar51 = dVar50 * 0.0722 +
                                 (double)(int)((uVar29 >> 8 & 0xff) - (uVar20 >> 8 & 0xff)) * 0.7152
                                 + dVar52 * 0.2126;
                        dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                        dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                        dVar51 = dVar51 * cfg->luminanceWeight_;
                        dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                      }
                      if (dVar50 < dVar49) {
                        dVar50 = 0.0;
                        if (uVar20 != uVar15) {
                          dVar52 = (double)(int)((uVar20 >> 0x10 & 0xff) - (uVar15 >> 0x10 & 0xff));
                          dVar50 = (double)(int)((uVar20 & 0xff) - (uVar15 & 0xff));
                          dVar51 = dVar50 * 0.0722 +
                                   (double)(int)((uVar20 >> 8 & 0xff) - (uVar15 >> 8 & 0xff)) *
                                   0.7152 + dVar52 * 0.2126;
                          dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                          dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                          dVar51 = dVar51 * cfg->luminanceWeight_;
                          dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                        }
                        if (dVar50 < dVar49) {
                          dVar50 = 0.0;
                          if (uVar15 != uVar19) {
                            dVar52 = (double)(int)((uVar15 >> 0x10 & 0xff) - (uVar19 >> 0x10 & 0xff)
                                                  );
                            dVar50 = (double)(int)((uVar15 & 0xff) - (uVar19 & 0xff));
                            dVar51 = dVar50 * 0.0722 +
                                     (double)(int)((uVar15 >> 8 & 0xff) - (uVar19 >> 8 & 0xff)) *
                                     0.7152 + dVar52 * 0.2126;
                            dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                            dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                            dVar51 = dVar51 * cfg->luminanceWeight_;
                            dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                          }
                          if (dVar50 < dVar49) {
                            dVar50 = 0.0;
                            if (uVar40 != uVar20) {
                              dVar52 = (double)(int)((uVar40 >> 0x10 & 0xff) -
                                                    (uVar20 >> 0x10 & 0xff));
                              dVar50 = (double)(int)((uVar40 & 0xff) - (uVar20 & 0xff));
                              dVar51 = dVar50 * 0.0722 +
                                       (double)(int)((uVar40 >> 8 & 0xff) - (uVar20 >> 8 & 0xff)) *
                                       0.7152 + dVar52 * 0.2126;
                              dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                              dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                              dVar51 = dVar51 * cfg->luminanceWeight_;
                              dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                            }
                            if (dVar49 <= dVar50) goto LAB_0041ad5b;
                          }
                        }
                      }
                    }
                  }
                  else {
                    dVar50 = 0.0;
                    if (uVar40 != uVar4) {
                      dVar51 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff));
                      dVar50 = (double)(int)((uVar40 & 0xff) - (uVar4 & 0xff));
                      dVar49 = dVar50 * 0.0722 +
                               (double)(int)((uVar40 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) * 0.7152 +
                               dVar51 * 0.2126;
                      dVar50 = (dVar50 - dVar49) * 0.5389092476826902;
                      dVar51 = (dVar51 - dVar49) * 0.63500127000254;
                      dVar49 = dVar49 * cfg->luminanceWeight_;
                      dVar50 = SQRT(dVar51 * dVar51 + dVar50 * dVar50 + dVar49 * dVar49);
                    }
                    if (dVar50 < cfg->equalColorTolerance_) goto LAB_0041a90c;
LAB_0041ad5b:
                    bVar47 = false;
                  }
                }
                dVar50 = 0.0;
                dVar49 = 0.0;
                if (uVar40 != uVar15) {
                  dVar52 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar15 >> 0x10 & 0xff));
                  dVar49 = (double)(int)((uVar40 & 0xff) - (uVar15 & 0xff));
                  dVar51 = dVar49 * 0.0722 +
                           (double)(int)((uVar40 >> 8 & 0xff) - (uVar15 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar49 = (dVar49 - dVar51) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                  dVar51 = dVar51 * cfg->luminanceWeight_;
                  dVar49 = SQRT(dVar52 * dVar52 + dVar49 * dVar49 + dVar51 * dVar51);
                }
                if (uVar40 != uVar29) {
                  dVar52 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar29 >> 0x10 & 0xff));
                  dVar50 = (double)(int)((uVar40 & 0xff) - (uVar29 & 0xff));
                  dVar51 = dVar50 * 0.0722 +
                           (double)(int)((uVar40 >> 8 & 0xff) - (uVar29 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                  dVar51 = dVar51 * cfg->luminanceWeight_;
                  dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                }
                uVar32 = uVar15;
                if (dVar50 < dVar49) {
                  uVar32 = uVar29;
                }
                if (bVar47) {
                  dVar50 = 0.0;
                  dVar49 = 0.0;
                  if (uVar15 != uVar4) {
                    dVar52 = (double)(int)((uVar15 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff));
                    dVar49 = (double)(int)((uVar15 & 0xff) - (uVar4 & 0xff));
                    dVar51 = dVar49 * 0.0722 +
                             (double)(int)((uVar15 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) * 0.7152 +
                             dVar52 * 0.2126;
                    dVar49 = (dVar49 - dVar51) * 0.5389092476826902;
                    dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                    dVar51 = dVar51 * cfg->luminanceWeight_;
                    dVar49 = SQRT(dVar52 * dVar52 + dVar49 * dVar49 + dVar51 * dVar51);
                  }
                  if (uVar29 != uVar19) {
                    dVar52 = (double)(int)((uVar29 >> 0x10 & 0xff) - (uVar19 >> 0x10 & 0xff));
                    dVar50 = (double)(int)((uVar29 & 0xff) - (uVar19 & 0xff));
                    dVar51 = dVar50 * 0.0722 +
                             (double)(int)((uVar29 >> 8 & 0xff) - (uVar19 >> 8 & 0xff)) * 0.7152 +
                             dVar52 * 0.2126;
                    dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                    dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                    dVar51 = dVar51 * cfg->luminanceWeight_;
                    dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                  }
                  bVar47 = dVar49 < cfg->steepDirectionThreshold * dVar50;
                  if (((dVar50 < cfg->steepDirectionThreshold * dVar49) || (uVar40 == uVar4)) ||
                     (uVar37 == uVar4)) {
                    uVar4 = uVar32 >> 0x18;
                    uVar21 = uVar32 & 0xff0000;
                    uVar18 = uVar32 & 0xff00;
                    if ((uVar28 == uVar19 || uVar40 == uVar19) || bVar47) {
                      uVar44 = puVar46[uVar12];
                      uVar36 = ((uVar44 >> 0x18) * 7 + uVar4 & 0xfffffff8) << 0x15;
                      uVar31 = uVar36;
                      if (uVar44 >> 0x18 == 0xff) {
                        uVar31 = 0xff000000;
                      }
                      if (uVar4 != 0xff) {
                        uVar31 = uVar36;
                      }
                      uVar35 = uVar32 & 0xff;
                      puVar46[uVar12] =
                           (uVar44 * 8 - (uVar44 & 0xff)) + uVar35 >> 3 & 0xff |
                           (uVar44 & 0xff00) * 7 + uVar18 >> 3 & 0xff00 |
                           (uVar44 & 0xff0000) * 7 + uVar21 >> 3 & 0xff0000 | uVar31;
                      uVar44 = *puVar46;
                      uVar36 = (uVar4 * 7 + (uVar44 >> 0x18) & 0xfffffff8) << 0x15;
                      uVar31 = uVar36;
                      if (uVar44 >> 0x18 == 0xff) {
                        uVar31 = 0xff000000;
                      }
                      if (uVar4 != 0xff) {
                        uVar31 = uVar36;
                      }
                      uVar36 = puVar46[1];
                      uVar33 = ((uVar36 >> 0x18) * 7 + uVar4 & 0xfffffff8) << 0x15;
                      uVar42 = uVar33;
                      if (uVar36 >> 0x18 == 0xff) {
                        uVar42 = 0xff000000;
                      }
                      if (uVar4 != 0xff) {
                        uVar42 = uVar33;
                      }
                      puVar46[1] = (uVar36 * 8 - (uVar36 & 0xff)) + uVar35 >> 3 & 0xff |
                                   (uVar36 & 0xff00) * 7 + uVar18 >> 3 & 0xff00 |
                                   (uVar36 & 0xff0000) * 7 + uVar21 >> 3 & 0xff0000 | uVar42;
                      uVar32 = (uVar44 & 0xff) + (uVar32 * 8 - uVar35) >> 3 & 0xff |
                               (uVar44 & 0xff00) + uVar18 * 7 >> 3 & 0xff00 |
                               (uVar44 & 0xff0000) + uVar21 * 7 >> 3 & 0xff0000 | uVar31;
                    }
                    else {
                      uVar44 = puVar46[uVar12 * 2];
                      uVar36 = ((uVar44 >> 0x18) * 3 + uVar4 & 0xfffffffc) << 0x16;
                      uVar31 = uVar36;
                      if (uVar44 >> 0x18 == 0xff) {
                        uVar31 = 0xff000000;
                      }
                      if (uVar4 != 0xff) {
                        uVar31 = uVar36;
                      }
                      uVar35 = uVar32 & 0xff;
                      puVar46[uVar12 * 2] =
                           (uVar44 & 0xff) * 3 + uVar35 >> 2 & 0xff |
                           (uVar44 & 0xff00) * 3 + uVar18 >> 2 & 0xff00 |
                           (uVar44 & 0xff0000) * 3 + uVar21 >> 2 & 0xff0000 | uVar31;
                      uVar44 = puVar46[1];
                      uVar36 = ((uVar44 >> 0x18) * 3 + uVar4 & 0xfffffffc) << 0x16;
                      uVar31 = uVar36;
                      if (uVar44 >> 0x18 == 0xff) {
                        uVar31 = 0xff000000;
                      }
                      if (uVar4 != 0xff) {
                        uVar31 = uVar36;
                      }
                      puVar46[1] = (uVar44 & 0xff) * 3 + uVar35 >> 2 & 0xff |
                                   (uVar44 & 0xff00) * 3 + uVar18 >> 2 & 0xff00 |
                                   (uVar44 & 0xff0000) * 3 + uVar21 >> 2 & 0xff0000 | uVar31;
                      uVar44 = puVar46[uVar12];
                      uVar36 = (uVar4 * 3 + (uVar44 >> 0x18) & 0xfffffffc) << 0x16;
                      uVar31 = uVar36;
                      if (uVar44 >> 0x18 == 0xff) {
                        uVar31 = 0xff000000;
                      }
                      if (uVar4 != 0xff) {
                        uVar31 = uVar36;
                      }
                      puVar46[uVar12] =
                           (uVar44 & 0xff) + uVar35 * 3 >> 2 & 0xff |
                           (uVar44 & 0xff00) + uVar18 * 3 >> 2 & 0xff00 |
                           (uVar44 & 0xff0000) + uVar21 * 3 >> 2 & 0xff0000 | uVar31;
                    }
                  }
                  else {
                    uVar21 = uVar32 >> 0x18;
                    uVar4 = puVar46[2];
                    uVar18 = ((uVar4 >> 0x18) * 3 + uVar21 & 0xfffffffc) << 0x16;
                    if (uVar4 >> 0x18 == 0xff && uVar21 == 0xff) {
                      uVar18 = 0xff000000;
                    }
                    uVar36 = uVar32 & 0xff0000;
                    uVar44 = uVar32 & 0xff00;
                    uVar31 = uVar32 & 0xff;
                    puVar46[2] = (uVar4 & 0xff) * 3 + uVar31 >> 2 & 0xff |
                                 (uVar4 & 0xff00) * 3 + uVar44 >> 2 & 0xff00 |
                                 (uVar4 & 0xff0000) * 3 + uVar36 >> 2 & 0xff0000 | uVar18;
                    if ((uVar28 == uVar19 || uVar40 == uVar19) || bVar47) {
                      uVar4 = puVar46[uVar12];
                      uVar35 = ((uVar4 >> 0x18) * 3 + uVar21 & 0xfffffffc) << 0x16;
                      uVar18 = uVar35;
                      if (uVar4 >> 0x18 == 0xff) {
                        uVar18 = 0xff000000;
                      }
                      if (uVar21 != 0xff) {
                        uVar18 = uVar35;
                      }
                      puVar46[uVar12] =
                           (uVar4 & 0xff) * 3 + uVar31 >> 2 & 0xff |
                           (uVar4 & 0xff00) * 3 + uVar44 >> 2 & 0xff00 |
                           (uVar4 & 0xff0000) * 3 + uVar36 >> 2 & 0xff0000 | uVar18;
                      uVar4 = puVar46[1];
                      uVar35 = (uVar21 * 3 + (uVar4 >> 0x18) & 0xfffffffc) << 0x16;
                      uVar18 = uVar35;
                      if (uVar4 >> 0x18 == 0xff) {
                        uVar18 = 0xff000000;
                      }
                      if (uVar21 != 0xff) {
                        uVar18 = uVar35;
                      }
                      puVar46[1] = (uVar4 & 0xff) + uVar31 * 3 >> 2 & 0xff |
                                   (uVar4 & 0xff00) + uVar44 * 3 >> 2 & 0xff00 |
                                   (uVar4 & 0xff0000) + uVar36 * 3 >> 2 & 0xff0000 | uVar18;
                    }
                    else {
                      uVar4 = puVar46[uVar12 * 2];
                      uVar35 = ((uVar4 >> 0x18) * 3 + uVar21 & 0xfffffffc) << 0x16;
                      uVar18 = uVar35;
                      if (uVar4 >> 0x18 == 0xff) {
                        uVar18 = 0xff000000;
                      }
                      if (uVar21 != 0xff) {
                        uVar18 = uVar35;
                      }
                      puVar46[uVar12 * 2] =
                           (uVar4 & 0xff) * 3 + uVar31 >> 2 & 0xff |
                           (uVar4 & 0xff00) * 3 + uVar44 >> 2 & 0xff00 |
                           (uVar4 & 0xff0000) * 3 + uVar36 >> 2 & 0xff0000 | uVar18;
                      uVar4 = puVar46[1];
                      uVar35 = ((uVar4 >> 0x18) + uVar21 * 3 & 0xfffffffc) << 0x16;
                      uVar18 = uVar35;
                      if (uVar4 >> 0x18 == 0xff) {
                        uVar18 = 0xff000000;
                      }
                      if (uVar21 != 0xff) {
                        uVar18 = uVar35;
                      }
                      puVar46[1] = (uVar4 & 0xff) + uVar31 * 3 >> 2 & 0xff |
                                   (uVar4 & 0xff00) + uVar44 * 3 >> 2 & 0xff00 |
                                   (uVar4 & 0xff0000) + uVar36 * 3 >> 2 & 0xff0000 | uVar18;
                      uVar4 = puVar46[uVar12];
                      uVar35 = (uVar21 * 3 + (uVar4 >> 0x18) & 0xfffffffc) << 0x16;
                      uVar18 = uVar35;
                      if (uVar4 >> 0x18 == 0xff) {
                        uVar18 = 0xff000000;
                      }
                      if (uVar21 != 0xff) {
                        uVar18 = uVar35;
                      }
                      puVar46[uVar12] =
                           (uVar4 & 0xff) + uVar31 * 3 >> 2 & 0xff |
                           (uVar4 & 0xff00) + uVar44 * 3 >> 2 & 0xff00 |
                           (uVar4 & 0xff0000) + uVar36 * 3 >> 2 & 0xff0000 | uVar18;
                    }
                  }
                }
                else {
                  uVar4 = *puVar46;
                  if ((uVar32 >> 0x18 != 0xff) || (uVar18 = 0xff000000, uVar4 >> 0x18 != 0xff)) {
                    uVar18 = ((uVar4 >> 0x18) * 0x37 + (uVar32 >> 0x18) * 0x2d) / 100 << 0x18;
                  }
                  uVar32 = ((uVar4 & 0xff) * 0x37 + (uVar32 & 0xff) * 0x2d) / 100 & 0xff |
                           ((uVar4 & 0xff00) * 0x37 + (uVar32 & 0xff00) * 0x2d) / 100 & 0xff00 |
                           ((uVar4 & 0xff0000) * 0x37 + (uVar32 & 0xff0000) * 0x2d) / 100 & 0xff0000
                           | uVar18;
                }
                *puVar46 = uVar32;
              }
              if ((bVar3 & 0xc0) != 0) {
                bVar47 = true;
                if ((bVar3 & 0x80) == 0) {
                  if (cVar8 == '\0' && (bVar3 & 0x30) == 0) {
LAB_0041b8c4:
                    if (0x3f < (byte)(bVar3 << 6 | bVar9 >> 2)) {
                      dVar50 = 0.0;
                      if (uVar40 != uVar5) {
                        dVar51 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                        dVar50 = (double)(int)((uVar40 & 0xff) - (uVar5 & 0xff));
                        dVar49 = dVar50 * 0.0722 +
                                 (double)(int)((uVar40 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152
                                 + dVar51 * 0.2126;
                        dVar50 = (dVar50 - dVar49) * 0.5389092476826902;
                        dVar51 = (dVar51 - dVar49) * 0.63500127000254;
                        dVar49 = dVar49 * cfg->luminanceWeight_;
                        dVar50 = SQRT(dVar51 * dVar51 + dVar50 * dVar50 + dVar49 * dVar49);
                      }
                      if (cfg->equalColorTolerance_ <= dVar50) goto LAB_0041bcef;
                    }
                    dVar50 = 0.0;
                    if (uVar20 != uVar15) {
                      dVar51 = (double)(int)((uVar20 >> 0x10 & 0xff) - (uVar15 >> 0x10 & 0xff));
                      dVar50 = (double)(int)((uVar20 & 0xff) - (uVar15 & 0xff));
                      dVar49 = dVar50 * 0.0722 +
                               (double)(int)((uVar20 >> 8 & 0xff) - (uVar15 >> 8 & 0xff)) * 0.7152 +
                               dVar51 * 0.2126;
                      dVar50 = (dVar50 - dVar49) * 0.5389092476826902;
                      dVar51 = (dVar51 - dVar49) * 0.63500127000254;
                      dVar49 = dVar49 * cfg->luminanceWeight_;
                      dVar50 = SQRT(dVar51 * dVar51 + dVar50 * dVar50 + dVar49 * dVar49);
                    }
                    dVar49 = cfg->equalColorTolerance_;
                    if (dVar50 < dVar49) {
                      dVar50 = 0.0;
                      if (uVar15 != uVar19) {
                        dVar52 = (double)(int)((uVar15 >> 0x10 & 0xff) - (uVar19 >> 0x10 & 0xff));
                        dVar50 = (double)(int)((uVar15 & 0xff) - (uVar19 & 0xff));
                        dVar51 = dVar50 * 0.0722 +
                                 (double)(int)((uVar15 >> 8 & 0xff) - (uVar19 >> 8 & 0xff)) * 0.7152
                                 + dVar52 * 0.2126;
                        dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                        dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                        dVar51 = dVar51 * cfg->luminanceWeight_;
                        dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                      }
                      if (dVar50 < dVar49) {
                        dVar50 = 0.0;
                        if (uVar19 != uVar28) {
                          dVar52 = (double)(int)((uVar19 >> 0x10 & 0xff) - (uVar28 >> 0x10 & 0xff));
                          dVar50 = (double)(int)((uVar19 & 0xff) - (uVar28 & 0xff));
                          dVar51 = dVar50 * 0.0722 +
                                   (double)(int)((uVar19 >> 8 & 0xff) - (uVar28 >> 8 & 0xff)) *
                                   0.7152 + dVar52 * 0.2126;
                          dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                          dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                          dVar51 = dVar51 * cfg->luminanceWeight_;
                          dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                        }
                        if (dVar50 < dVar49) {
                          dVar50 = 0.0;
                          if (uVar28 != uVar5) {
                            dVar52 = (double)(int)((uVar28 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff))
                            ;
                            dVar50 = (double)(int)((uVar28 & 0xff) - (uVar5 & 0xff));
                            dVar51 = dVar50 * 0.0722 +
                                     (double)(int)((uVar28 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) *
                                     0.7152 + dVar52 * 0.2126;
                            dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                            dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                            dVar51 = dVar51 * cfg->luminanceWeight_;
                            dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                          }
                          if (dVar50 < dVar49) {
                            dVar50 = 0.0;
                            if (uVar40 != uVar19) {
                              dVar52 = (double)(int)((uVar40 >> 0x10 & 0xff) -
                                                    (uVar19 >> 0x10 & 0xff));
                              dVar50 = (double)(int)((uVar40 & 0xff) - (uVar19 & 0xff));
                              dVar51 = dVar50 * 0.0722 +
                                       (double)(int)((uVar40 >> 8 & 0xff) - (uVar19 >> 8 & 0xff)) *
                                       0.7152 + dVar52 * 0.2126;
                              dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                              dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                              dVar51 = dVar51 * cfg->luminanceWeight_;
                              dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                            }
                            if (dVar49 <= dVar50) goto LAB_0041bcef;
                          }
                        }
                      }
                    }
                  }
                  else {
                    dVar50 = 0.0;
                    if (uVar40 != uVar20) {
                      dVar51 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar20 >> 0x10 & 0xff));
                      dVar50 = (double)(int)((uVar40 & 0xff) - (uVar20 & 0xff));
                      dVar49 = dVar50 * 0.0722 +
                               (double)(int)((uVar40 >> 8 & 0xff) - (uVar20 >> 8 & 0xff)) * 0.7152 +
                               dVar51 * 0.2126;
                      dVar50 = (dVar50 - dVar49) * 0.5389092476826902;
                      dVar51 = (dVar51 - dVar49) * 0.63500127000254;
                      dVar49 = dVar49 * cfg->luminanceWeight_;
                      dVar50 = SQRT(dVar51 * dVar51 + dVar50 * dVar50 + dVar49 * dVar49);
                    }
                    if (dVar50 < cfg->equalColorTolerance_) goto LAB_0041b8c4;
LAB_0041bcef:
                    bVar47 = false;
                  }
                }
                dVar50 = 0.0;
                dVar49 = 0.0;
                if (uVar40 != uVar28) {
                  dVar52 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar28 >> 0x10 & 0xff));
                  dVar49 = (double)(int)((uVar40 & 0xff) - (uVar28 & 0xff));
                  dVar51 = dVar49 * 0.0722 +
                           (double)(int)((uVar40 >> 8 & 0xff) - (uVar28 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar49 = (dVar49 - dVar51) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                  dVar51 = dVar51 * cfg->luminanceWeight_;
                  dVar49 = SQRT(dVar52 * dVar52 + dVar49 * dVar49 + dVar51 * dVar51);
                }
                if (uVar40 != uVar15) {
                  dVar52 = (double)(int)((uVar40 >> 0x10 & 0xff) - (uVar15 >> 0x10 & 0xff));
                  dVar50 = (double)(int)((uVar40 & 0xff) - (uVar15 & 0xff));
                  dVar51 = dVar50 * 0.0722 +
                           (double)(int)((uVar40 >> 8 & 0xff) - (uVar15 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                  dVar51 = dVar51 * cfg->luminanceWeight_;
                  dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                }
                uVar4 = uVar28;
                if (dVar50 < dVar49) {
                  uVar4 = uVar15;
                }
                if (bVar47) {
                  dVar50 = 0.0;
                  dVar49 = 0.0;
                  if (uVar28 != uVar20) {
                    dVar52 = (double)(int)((uVar28 >> 0x10 & 0xff) - (uVar20 >> 0x10 & 0xff));
                    dVar49 = (double)(int)((uVar28 & 0xff) - (uVar20 & 0xff));
                    dVar51 = dVar49 * 0.0722 +
                             (double)(int)((uVar28 >> 8 & 0xff) - (uVar20 >> 8 & 0xff)) * 0.7152 +
                             dVar52 * 0.2126;
                    dVar49 = (dVar49 - dVar51) * 0.5389092476826902;
                    dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                    dVar51 = dVar51 * cfg->luminanceWeight_;
                    dVar49 = SQRT(dVar52 * dVar52 + dVar49 * dVar49 + dVar51 * dVar51);
                  }
                  if (uVar15 != uVar5) {
                    dVar52 = (double)(int)((uVar15 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                    dVar50 = (double)(int)((uVar15 & 0xff) - (uVar5 & 0xff));
                    dVar51 = dVar50 * 0.0722 +
                             (double)(int)((uVar15 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152 +
                             dVar52 * 0.2126;
                    dVar50 = (dVar50 - dVar51) * 0.5389092476826902;
                    dVar52 = (dVar52 - dVar51) * 0.63500127000254;
                    dVar51 = dVar51 * cfg->luminanceWeight_;
                    dVar50 = SQRT(dVar52 * dVar52 + dVar50 * dVar50 + dVar51 * dVar51);
                  }
                  bVar47 = dVar49 < cfg->steepDirectionThreshold * dVar50;
                  uVar15 = uVar4 >> 0x18;
                  if (((dVar50 < cfg->steepDirectionThreshold * dVar49) || (uVar40 == uVar20)) ||
                     (uVar29 == uVar20)) {
                    uVar29 = uVar4 & 0xff0000;
                    uVar20 = uVar4 & 0xff00;
                    if ((uVar37 == uVar5 || uVar40 == uVar5) || bVar47) {
                      uVar40 = puVar46[uVar12 * 2 + 1];
                      uVar19 = ((uVar40 >> 0x18) * 7 + uVar15 & 0xfffffff8) << 0x15;
                      uVar37 = uVar19;
                      if (uVar40 >> 0x18 == 0xff) {
                        uVar37 = 0xff000000;
                      }
                      if (uVar15 != 0xff) {
                        uVar37 = uVar19;
                      }
                      uVar19 = uVar4 & 0xff;
                      puVar46[uVar12 * 2 + 1] =
                           (uVar40 * 8 - (uVar40 & 0xff)) + uVar19 >> 3 & 0xff |
                           (uVar40 & 0xff00) * 7 + uVar20 >> 3 & 0xff00 |
                           (uVar40 & 0xff0000) * 7 + uVar29 >> 3 & 0xff0000 | uVar37;
                      uVar40 = puVar46[uVar12];
                      uVar28 = ((uVar40 >> 0x18) * 7 + uVar15 & 0xfffffff8) << 0x15;
                      uVar37 = uVar28;
                      if (uVar40 >> 0x18 == 0xff) {
                        uVar37 = 0xff000000;
                      }
                      if (uVar15 != 0xff) {
                        uVar37 = uVar28;
                      }
                      puVar46[uVar12] =
                           (uVar40 * 8 - (uVar40 & 0xff)) + uVar19 >> 3 & 0xff |
                           (uVar40 & 0xff00) * 7 + uVar20 >> 3 & 0xff00 |
                           (uVar40 & 0xff0000) * 7 + uVar29 >> 3 & 0xff0000 | uVar37;
                      uVar40 = puVar46[uVar12 * 2];
                      uVar28 = (uVar15 * 7 + (uVar40 >> 0x18) & 0xfffffff8) << 0x15;
                      uVar37 = uVar28;
                      if (uVar40 >> 0x18 == 0xff) {
                        uVar37 = 0xff000000;
                      }
                      if (uVar15 != 0xff) {
                        uVar37 = uVar28;
                      }
                      puVar46[uVar12 * 2] =
                           (uVar40 & 0xff) + (uVar4 * 8 - uVar19) >> 3 & 0xff |
                           (uVar40 & 0xff00) + uVar20 * 7 >> 3 & 0xff00 |
                           (uVar40 & 0xff0000) + uVar29 * 7 >> 3 & 0xff0000 | uVar37;
                    }
                    else {
                      uVar40 = puVar46[uVar12 * 2 + 2];
                      uVar19 = ((uVar40 >> 0x18) * 3 + uVar15 & 0xfffffffc) << 0x16;
                      uVar37 = uVar19;
                      if (uVar40 >> 0x18 == 0xff) {
                        uVar37 = 0xff000000;
                      }
                      if (uVar15 != 0xff) {
                        uVar37 = uVar19;
                      }
                      uVar19 = uVar4 & 0xff;
                      puVar46[uVar12 * 2 + 2] =
                           (uVar40 & 0xff) * 3 + uVar19 >> 2 & 0xff |
                           (uVar40 & 0xff00) * 3 + uVar20 >> 2 & 0xff00 |
                           (uVar40 & 0xff0000) * 3 + uVar29 >> 2 & 0xff0000 | uVar37;
                      uVar40 = puVar46[uVar12];
                      uVar28 = ((uVar40 >> 0x18) * 3 + uVar15 & 0xfffffffc) << 0x16;
                      uVar37 = uVar28;
                      if (uVar40 >> 0x18 == 0xff) {
                        uVar37 = 0xff000000;
                      }
                      if (uVar15 != 0xff) {
                        uVar37 = uVar28;
                      }
                      puVar46[uVar12] =
                           (uVar40 & 0xff) * 3 + uVar19 >> 2 & 0xff |
                           (uVar40 & 0xff00) * 3 + uVar20 >> 2 & 0xff00 |
                           (uVar40 & 0xff0000) * 3 + uVar29 >> 2 & 0xff0000 | uVar37;
                      uVar40 = puVar46[uVar12 * 2 + 1];
                      uVar28 = (uVar15 * 3 + (uVar40 >> 0x18) & 0xfffffffc) << 0x16;
                      uVar37 = uVar28;
                      if (uVar40 >> 0x18 == 0xff) {
                        uVar37 = 0xff000000;
                      }
                      if (uVar15 != 0xff) {
                        uVar37 = uVar28;
                      }
                      puVar46[uVar12 * 2 + 1] =
                           (uVar40 & 0xff) + uVar19 * 3 >> 2 & 0xff |
                           (uVar40 & 0xff00) + uVar20 * 3 >> 2 & 0xff00 |
                           (uVar40 & 0xff0000) + uVar29 * 3 >> 2 & 0xff0000 | uVar37;
                      puVar46[uVar12 * 2] = uVar4;
                    }
                  }
                  else {
                    uVar20 = *puVar46;
                    uVar29 = ((uVar20 >> 0x18) * 3 + uVar15 & 0xfffffffc) << 0x16;
                    if (uVar20 >> 0x18 == 0xff && uVar15 == 0xff) {
                      uVar29 = 0xff000000;
                    }
                    uVar32 = uVar4 & 0xff0000;
                    uVar28 = uVar4 & 0xff00;
                    uVar19 = uVar4 & 0xff;
                    *puVar46 = (uVar20 & 0xff) * 3 + uVar19 >> 2 & 0xff |
                               (uVar20 & 0xff00) * 3 + uVar28 >> 2 & 0xff00 |
                               (uVar20 & 0xff0000) * 3 + uVar32 >> 2 & 0xff0000 | uVar29;
                    if ((uVar37 == uVar5 || uVar40 == uVar5) || bVar47) {
                      uVar20 = puVar46[uVar12 * 2 + 1];
                      uVar40 = ((uVar20 >> 0x18) * 3 + uVar15 & 0xfffffffc) << 0x16;
                      uVar29 = uVar40;
                      if (uVar20 >> 0x18 == 0xff) {
                        uVar29 = 0xff000000;
                      }
                      if (uVar15 != 0xff) {
                        uVar29 = uVar40;
                      }
                      puVar46[uVar12 * 2 + 1] =
                           (uVar20 & 0xff) * 3 + uVar19 >> 2 & 0xff |
                           (uVar20 & 0xff00) * 3 + uVar28 >> 2 & 0xff00 |
                           (uVar20 & 0xff0000) * 3 + uVar32 >> 2 & 0xff0000 | uVar29;
                      uVar20 = puVar46[uVar12];
                      uVar40 = (uVar15 * 3 + (uVar20 >> 0x18) & 0xfffffffc) << 0x16;
                      uVar29 = uVar40;
                      if (uVar20 >> 0x18 == 0xff) {
                        uVar29 = 0xff000000;
                      }
                      if (uVar15 != 0xff) {
                        uVar29 = uVar40;
                      }
                      puVar46[uVar12] =
                           (uVar20 & 0xff) + uVar19 * 3 >> 2 & 0xff |
                           (uVar20 & 0xff00) + uVar28 * 3 >> 2 & 0xff00 |
                           (uVar20 & 0xff0000) + uVar32 * 3 >> 2 & 0xff0000 | uVar29;
                      puVar46[uVar12 * 2] = uVar4;
                    }
                    else {
                      uVar20 = puVar46[uVar12 * 2 + 2];
                      uVar40 = ((uVar20 >> 0x18) * 3 + uVar15 & 0xfffffffc) << 0x16;
                      uVar29 = uVar40;
                      if (uVar20 >> 0x18 == 0xff) {
                        uVar29 = 0xff000000;
                      }
                      if (uVar15 != 0xff) {
                        uVar29 = uVar40;
                      }
                      puVar46[uVar12 * 2 + 2] =
                           (uVar20 & 0xff) * 3 + uVar19 >> 2 & 0xff |
                           (uVar20 & 0xff00) * 3 + uVar28 >> 2 & 0xff00 |
                           (uVar20 & 0xff0000) * 3 + uVar32 >> 2 & 0xff0000 | uVar29;
                      uVar20 = puVar46[uVar12];
                      uVar40 = ((uVar20 >> 0x18) + uVar15 * 3 & 0xfffffffc) << 0x16;
                      uVar29 = uVar40;
                      if (uVar20 >> 0x18 == 0xff) {
                        uVar29 = 0xff000000;
                      }
                      if (uVar15 != 0xff) {
                        uVar29 = uVar40;
                      }
                      puVar46[uVar12] =
                           (uVar20 & 0xff) + uVar19 * 3 >> 2 & 0xff |
                           (uVar20 & 0xff00) + uVar28 * 3 >> 2 & 0xff00 |
                           (uVar20 & 0xff0000) + uVar32 * 3 >> 2 & 0xff0000 | uVar29;
                      uVar20 = puVar46[uVar12 * 2 + 1];
                      uVar40 = (uVar15 * 3 + (uVar20 >> 0x18) & 0xfffffffc) << 0x16;
                      uVar29 = uVar40;
                      if (uVar20 >> 0x18 == 0xff) {
                        uVar29 = 0xff000000;
                      }
                      if (uVar15 != 0xff) {
                        uVar29 = uVar40;
                      }
                      puVar46[uVar12 * 2 + 1] =
                           (uVar20 & 0xff) + uVar19 * 3 >> 2 & 0xff |
                           (uVar20 & 0xff00) + uVar28 * 3 >> 2 & 0xff00 |
                           (uVar20 & 0xff0000) + uVar32 * 3 >> 2 & 0xff0000 | uVar29;
                      puVar46[uVar12 * 2] = uVar4;
                    }
                  }
                }
                else {
                  uVar20 = puVar46[uVar12 * 2];
                  if ((uVar4 >> 0x18 != 0xff) || (uVar29 = 0xff000000, uVar20 >> 0x18 != 0xff)) {
                    uVar29 = ((uVar20 >> 0x18) * 0x37 + (uVar4 >> 0x18) * 0x2d) / 100 << 0x18;
                  }
                  puVar46[uVar12 * 2] =
                       ((uVar20 & 0xff) * 0x37 + (uVar4 & 0xff) * 0x2d) / 100 & 0xff |
                       ((uVar20 & 0xff00) * 0x37 + (uVar4 & 0xff00) * 0x2d) / 100 & 0xff00 |
                       ((uVar20 & 0xff0000) * 0x37 + (uVar4 & 0xff0000) * 0x2d) / 100 & 0xff0000 |
                       uVar29;
                }
              }
            }
            puVar46 = puVar46 + 3;
            local_b0 = uVar16;
          } while (uVar16 != __n);
        }
        uVar16 = uVar1;
      } while (uVar1 != (uint)yLast);
    }
  }
  return;
}

Assistant:

void scaleImage(const uint32_t* src, uint32_t* trg, int srcWidth, int srcHeight, const xbrz_old::ScalerCfg& cfg, int yFirst, int yLast)
{
    yFirst = std::max(yFirst, 0);
    yLast  = std::min(yLast, srcHeight);
    if (yFirst >= yLast || srcWidth <= 0)
        return;

    const int trgWidth = srcWidth * Scaler::scale;

    //"use" space at the end of the image as temporary buffer for "on the fly preprocessing": we even could use larger area of
    //"sizeof(uint32_t) * srcWidth * (yLast - yFirst)" bytes without risk of accidental overwriting before accessing
    const int bufferSize = srcWidth;
    unsigned char* preProcBuffer = reinterpret_cast<unsigned char*>(trg + yLast * Scaler::scale * trgWidth) - bufferSize;
    std::fill(preProcBuffer, preProcBuffer + bufferSize, 0);
#ifdef XBRZ_CXX11
    static_assert(BLEND_NONE == 0, "");
#endif // XBRZ_CXX11

    //initialize preprocessing buffer for first row: detect upper left and right corner blending
    //this cannot be optimized for adjacent processing stripes; we must not allow for a memory race condition!
    if (yFirst > 0)
    {
        const int y = yFirst - 1;

        const uint32_t* s_m1 = src + srcWidth * std::max(y - 1, 0);
        const uint32_t* s_0  = src + srcWidth * y; //center line
        const uint32_t* s_p1 = src + srcWidth * std::min(y + 1, srcHeight - 1);
        const uint32_t* s_p2 = src + srcWidth * std::min(y + 2, srcHeight - 1);

        for (int x = 0; x < srcWidth; ++x)
        {
            const int x_m1 = std::max(x - 1, 0);
            const int x_p1 = std::min(x + 1, srcWidth - 1);
            const int x_p2 = std::min(x + 2, srcWidth - 1);

            Kernel_4x4 ker = {}; //perf: initialization is negligable
            ker.a = s_m1[x_m1]; //read sequentially from memory as far as possible
            ker.b = s_m1[x];
            ker.c = s_m1[x_p1];
            ker.d = s_m1[x_p2];

            ker.e = s_0[x_m1];
            ker.f = s_0[x];
            ker.g = s_0[x_p1];
            ker.h = s_0[x_p2];

            ker.i = s_p1[x_m1];
            ker.j = s_p1[x];
            ker.k = s_p1[x_p1];
            ker.l = s_p1[x_p2];

            ker.m = s_p2[x_m1];
            ker.n = s_p2[x];
            ker.o = s_p2[x_p1];
            ker.p = s_p2[x_p2];

            const BlendResult res = preProcessCorners(ker, cfg);
            /*
            preprocessing blend result:
            ---------
            | F | G |   //evalute corner between F, G, J, K
            ----|---|   //input pixel is at position F
            | J | K |
            ---------
            */
            setTopR(preProcBuffer[x], res.blend_j);

            if (x + 1 < srcWidth)
                setTopL(preProcBuffer[x + 1], res.blend_k);
        }
    }
    //------------------------------------------------------------------------------------

    for (int y = yFirst; y < yLast; ++y)
    {
        uint32_t* out = trg + Scaler::scale * y * trgWidth; //consider MT "striped" access

        const uint32_t* s_m1 = src + srcWidth * std::max(y - 1, 0);
        const uint32_t* s_0  = src + srcWidth * y; //center line
        const uint32_t* s_p1 = src + srcWidth * std::min(y + 1, srcHeight - 1);
        const uint32_t* s_p2 = src + srcWidth * std::min(y + 2, srcHeight - 1);

        unsigned char blend_xy1 = 0; //corner blending for current (x, y + 1) position

        for (int x = 0; x < srcWidth; ++x, out += Scaler::scale)
        {
#ifndef NDEBUG
            breakIntoDebugger = debugPixelX == x && debugPixelY == y;
#endif
            //all those bounds checks have only insignificant impact on performance!
            const int x_m1 = std::max(x - 1, 0); //perf: prefer array indexing to additional pointers!
            const int x_p1 = std::min(x + 1, srcWidth - 1);
            const int x_p2 = std::min(x + 2, srcWidth - 1);

            //evaluate the four corners on bottom-right of current pixel
            unsigned char blend_xy = 0; //for current (x, y) position
            {
                Kernel_4x4 ker = {}; //perf: initialization is negligable
                ker.a = s_m1[x_m1]; //read sequentially from memory as far as possible
                ker.b = s_m1[x];
                ker.c = s_m1[x_p1];
                ker.d = s_m1[x_p2];

                ker.e = s_0[x_m1];
                ker.f = s_0[x];
                ker.g = s_0[x_p1];
                ker.h = s_0[x_p2];

                ker.i = s_p1[x_m1];
                ker.j = s_p1[x];
                ker.k = s_p1[x_p1];
                ker.l = s_p1[x_p2];

                ker.m = s_p2[x_m1];
                ker.n = s_p2[x];
                ker.o = s_p2[x_p1];
                ker.p = s_p2[x_p2];

                const BlendResult res = preProcessCorners(ker, cfg);
                /*
                preprocessing blend result:
                ---------
                | F | G |   //evalute corner between F, G, J, K
                ----|---|   //current input pixel is at position F
                | J | K |
                ---------
                */
                blend_xy = preProcBuffer[x];
                setBottomR(blend_xy, res.blend_f); //all four corners of (x, y) have been determined at this point due to processing sequence!

                setTopR(blend_xy1, res.blend_j); //set 2nd known corner for (x, y + 1)
                preProcBuffer[x] = blend_xy1; //store on current buffer position for use on next row

                blend_xy1 = 0;
                setTopL(blend_xy1, res.blend_k); //set 1st known corner for (x + 1, y + 1) and buffer for use on next column

                if (x + 1 < srcWidth) //set 3rd known corner for (x + 1, y)
                    setBottomL(preProcBuffer[x + 1], res.blend_g);
            }

            //fill block of size scale * scale with the given color
            fillBlock(out, trgWidth * sizeof(uint32_t), s_0[x], Scaler::scale); //place *after* preprocessing step, to not overwrite the results while processing the the last pixel!

            //blend four corners of current pixel
            if (blendingNeeded(blend_xy)) //good 20% perf-improvement
            {
                Kernel_3x3 ker = {}; //perf: initialization is negligable

                ker.a = s_m1[x_m1]; //read sequentially from memory as far as possible
                ker.b = s_m1[x];
                ker.c = s_m1[x_p1];

                ker.d = s_0[x_m1];
                ker.e = s_0[x];
                ker.f = s_0[x_p1];

                ker.g = s_p1[x_m1];
                ker.h = s_p1[x];
                ker.i = s_p1[x_p1];

                scalePixel<Scaler, ROT_0  >(ker, out, trgWidth, blend_xy, cfg);
                scalePixel<Scaler, ROT_90 >(ker, out, trgWidth, blend_xy, cfg);
                scalePixel<Scaler, ROT_180>(ker, out, trgWidth, blend_xy, cfg);
                scalePixel<Scaler, ROT_270>(ker, out, trgWidth, blend_xy, cfg);
            }
        }
    }
}